

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_scan_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  longlong lVar13;
  ulong uVar14;
  ulong uVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  byte bVar75;
  char cVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int8_t *ptr_06;
  uint uVar80;
  int iVar81;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  byte bVar82;
  char cVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  byte bVar96;
  char cVar97;
  byte bVar98;
  char cVar99;
  byte bVar100;
  char cVar101;
  byte bVar102;
  char cVar103;
  byte bVar104;
  char cVar105;
  byte bVar106;
  char cVar107;
  char cVar109;
  byte bVar110;
  byte bVar111;
  char cVar112;
  byte bVar115;
  byte bVar116;
  char cVar117;
  byte bVar118;
  byte bVar119;
  char cVar120;
  byte bVar121;
  byte bVar122;
  char cVar123;
  byte bVar124;
  byte bVar125;
  char cVar126;
  byte bVar127;
  byte bVar128;
  char cVar129;
  byte bVar130;
  byte bVar131;
  char cVar132;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  byte bVar108;
  byte bVar133;
  ulong uVar113;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ulong uVar114;
  byte bVar134;
  char cVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  __m128i alVar138;
  __m128i alVar139;
  __m128i alVar140;
  __m128i alVar141;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  int local_16bc;
  int local_16ac;
  ulong uStack_1698;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *l;
  int8_t *s;
  int8_t *m;
  int8_t *t;
  __m128i cond_max;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t h;
  int local_1390;
  int local_138c;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_128c;
  int8_t local_128b;
  int8_t local_128a;
  byte local_1289;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  __m128i vOne;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  undefined1 local_1068 [8];
  undefined1 local_1060 [24];
  undefined1 local_1048 [8];
  undefined1 local_1040 [56];
  undefined1 local_1008 [8];
  undefined1 local_1000 [24];
  undefined1 local_fe8 [8];
  undefined1 local_fe0 [56];
  undefined1 local_fa8 [8];
  undefined1 local_fa0 [24];
  undefined1 local_f88 [8];
  undefined1 local_f80 [1512];
  char local_998;
  char cStack_997;
  char cStack_996;
  char cStack_995;
  char cStack_994;
  char cStack_993;
  char cStack_992;
  char cStack_991;
  char cStack_990;
  char cStack_98f;
  char cStack_98e;
  char cStack_98d;
  char cStack_98c;
  char cStack_98b;
  char cStack_98a;
  char cStack_989;
  char local_988;
  char cStack_987;
  char cStack_986;
  char cStack_985;
  char cStack_984;
  char cStack_983;
  char cStack_982;
  char cStack_981;
  char cStack_980;
  char cStack_97f;
  char cStack_97e;
  char cStack_97d;
  char cStack_97c;
  char cStack_97b;
  char cStack_97a;
  char cStack_979;
  char local_978;
  char cStack_977;
  char cStack_976;
  char cStack_975;
  char cStack_974;
  char cStack_973;
  char cStack_972;
  char cStack_971;
  char cStack_970;
  char cStack_96f;
  char cStack_96e;
  char cStack_96d;
  char cStack_96c;
  char cStack_96b;
  char cStack_96a;
  char cStack_969;
  char cStack_947;
  char cStack_946;
  char cStack_945;
  char cStack_944;
  char cStack_943;
  char cStack_942;
  char cStack_941;
  char cStack_940;
  char cStack_93f;
  char cStack_93e;
  char cStack_93d;
  char cStack_93c;
  char cStack_93b;
  char cStack_93a;
  char cStack_939;
  char local_938;
  char cStack_937;
  char cStack_936;
  char cStack_935;
  char cStack_934;
  char cStack_933;
  char cStack_932;
  char cStack_931;
  char cStack_930;
  char cStack_92f;
  char cStack_92e;
  char cStack_92d;
  char cStack_92c;
  char cStack_92b;
  char cStack_92a;
  char cStack_929;
  char local_928;
  char cStack_927;
  char cStack_926;
  char cStack_925;
  char cStack_924;
  char cStack_923;
  char cStack_922;
  char cStack_921;
  char cStack_920;
  char cStack_91f;
  char cStack_91e;
  char cStack_91d;
  char cStack_91c;
  char cStack_91b;
  char cStack_91a;
  char cStack_919;
  char local_918;
  char cStack_917;
  char cStack_916;
  char cStack_915;
  char cStack_914;
  char cStack_913;
  char cStack_912;
  char cStack_911;
  char cStack_910;
  char cStack_90f;
  char cStack_90e;
  char cStack_90d;
  char cStack_90c;
  char cStack_90b;
  char cStack_90a;
  char cStack_909;
  char local_8f8;
  char cStack_8f7;
  char cStack_8f6;
  char cStack_8f5;
  char cStack_8f4;
  char cStack_8f3;
  char cStack_8f2;
  char cStack_8f1;
  char cStack_8f0;
  char cStack_8ef;
  char cStack_8ee;
  char cStack_8ed;
  char cStack_8ec;
  char cStack_8eb;
  char cStack_8ea;
  char cStack_8e9;
  char local_8e8;
  char cStack_8e7;
  char cStack_8e6;
  char cStack_8e5;
  char cStack_8e4;
  char cStack_8e3;
  char cStack_8e2;
  char cStack_8e1;
  char cStack_8e0;
  char cStack_8df;
  char cStack_8de;
  char cStack_8dd;
  char cStack_8dc;
  char cStack_8db;
  char cStack_8da;
  char cStack_8d9;
  char local_8c8;
  char cStack_8c7;
  char cStack_8c6;
  char cStack_8c5;
  char cStack_8c4;
  char cStack_8c3;
  char cStack_8c2;
  char cStack_8c1;
  char cStack_8c0;
  char cStack_8bf;
  char cStack_8be;
  char cStack_8bd;
  char cStack_8bc;
  char cStack_8bb;
  char cStack_8ba;
  char cStack_8b9;
  char local_8a8;
  char cStack_8a7;
  char cStack_8a6;
  char cStack_8a5;
  char cStack_8a4;
  char cStack_8a3;
  char cStack_8a2;
  char cStack_8a1;
  char cStack_8a0;
  char cStack_89f;
  char cStack_89e;
  char cStack_89d;
  char cStack_89c;
  char cStack_89b;
  char cStack_89a;
  char cStack_899;
  char local_898;
  char cStack_897;
  char cStack_896;
  char cStack_895;
  char cStack_894;
  char cStack_893;
  char cStack_892;
  char cStack_891;
  char cStack_890;
  char cStack_88f;
  char cStack_88e;
  char cStack_88d;
  char cStack_88c;
  char cStack_88b;
  char cStack_88a;
  char cStack_889;
  char local_868;
  char cStack_867;
  char cStack_866;
  char cStack_865;
  char cStack_864;
  char cStack_863;
  char cStack_862;
  char cStack_861;
  char cStack_860;
  char cStack_85f;
  char cStack_85e;
  char cStack_85d;
  char cStack_85c;
  char cStack_85b;
  char cStack_85a;
  char cStack_859;
  char local_848;
  char cStack_847;
  char cStack_846;
  char cStack_845;
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  char cStack_839;
  char local_828;
  char cStack_827;
  char cStack_826;
  char cStack_825;
  char cStack_824;
  char cStack_823;
  char cStack_822;
  char cStack_821;
  char cStack_820;
  char cStack_81f;
  char cStack_81e;
  char cStack_81d;
  char cStack_81c;
  char cStack_81b;
  char cStack_81a;
  char cStack_819;
  char local_7f8;
  char cStack_7f7;
  char cStack_7f6;
  char cStack_7f5;
  char cStack_7f4;
  char cStack_7f3;
  char cStack_7f2;
  char cStack_7f1;
  char cStack_7f0;
  char cStack_7ef;
  char cStack_7ee;
  char cStack_7ed;
  char cStack_7ec;
  char cStack_7eb;
  char cStack_7ea;
  char cStack_7e9;
  char local_7c8;
  char cStack_7c7;
  char cStack_7c6;
  char cStack_7c5;
  char cStack_7c4;
  char cStack_7c3;
  char cStack_7c2;
  char cStack_7c1;
  char cStack_7c0;
  char cStack_7bf;
  char cStack_7be;
  char cStack_7bd;
  char cStack_7bc;
  char cStack_7bb;
  char cStack_7ba;
  char cStack_7b9;
  byte local_7b8;
  byte bStack_7b7;
  byte bStack_7b6;
  byte bStack_7b5;
  byte bStack_7b4;
  byte bStack_7b3;
  byte bStack_7b2;
  byte bStack_7b1;
  byte bStack_7b0;
  byte bStack_7af;
  byte bStack_7ae;
  byte bStack_7ad;
  byte bStack_7ac;
  byte bStack_7ab;
  byte bStack_7aa;
  byte bStack_7a9;
  char local_7a8;
  char cStack_7a7;
  char cStack_7a6;
  char cStack_7a5;
  char cStack_7a4;
  char cStack_7a3;
  char cStack_7a2;
  char cStack_7a1;
  char cStack_7a0;
  char cStack_79f;
  char cStack_79e;
  char cStack_79d;
  char cStack_79c;
  char cStack_79b;
  char cStack_79a;
  char cStack_799;
  char local_798;
  char cStack_797;
  char cStack_796;
  char cStack_795;
  char cStack_794;
  char cStack_793;
  char cStack_792;
  char cStack_791;
  char cStack_790;
  char cStack_78f;
  char cStack_78e;
  char cStack_78d;
  char cStack_78c;
  char cStack_78b;
  char cStack_78a;
  char cStack_789;
  char local_6f8;
  char cStack_6f7;
  char cStack_6f6;
  char cStack_6f5;
  char cStack_6f4;
  char cStack_6f3;
  char cStack_6f2;
  char cStack_6f1;
  char cStack_6f0;
  char cStack_6ef;
  char cStack_6ee;
  char cStack_6ed;
  char cStack_6ec;
  char cStack_6eb;
  char cStack_6ea;
  char cStack_6e9;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_sse41_128_8","profile")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_scan_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_scan_profile_sse41_128_8",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_sse41_128_8",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_scan_profile_sse41_128_8","gap"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar4 = profile->matrix;
    iVar77 = (iVar1 + 0xf) / 0x10;
    iVar81 = (iVar1 + -1) % iVar77;
    iVar78 = ~((iVar1 + -1) / iVar77) + 0x10;
    pvVar5 = (profile->profile8).score;
    pvVar6 = (profile->profile8).matches;
    pvVar7 = (profile->profile8).similar;
    s1_beg_local._0_1_ = (char)open;
    local_1060._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    local_1068._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    uVar8 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,local_1068._0_3_)))));
    uVar11 = CONCAT17((char)s1_beg_local,
                      CONCAT16((char)s1_beg_local,
                               CONCAT15((char)s1_beg_local,
                                        CONCAT14((char)s1_beg_local,
                                                 CONCAT13((char)s1_beg_local,local_1060._0_3_)))));
    i._0_1_ = (char)gap;
    local_1040._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    local_1048._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    uVar9 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_1048._0_3_)))));
    uVar12 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_1040._0_3_)))));
    if (ppVar4->min <= -open) {
      s1_beg_local._0_1_ = -(char)ppVar4->min;
    }
    bVar75 = (char)s1_beg_local + 0x81;
    cVar76 = ((byte)ppVar4->max ^ 0x7f) - 1;
    local_128a = '\0';
    local_128b = '\0';
    local_128c = '\0';
    local_1000._0_3_ = CONCAT21(CONCAT11(bVar75,bVar75),bVar75);
    local_1008._0_3_ = CONCAT21(CONCAT11(bVar75,bVar75),bVar75);
    lVar10 = CONCAT17(bVar75,CONCAT16(bVar75,CONCAT15(bVar75,CONCAT14(bVar75,CONCAT13(bVar75,
                                                  local_1008._0_3_)))));
    lVar13 = CONCAT17(bVar75,CONCAT16(bVar75,CONCAT15(bVar75,CONCAT14(bVar75,CONCAT13(bVar75,
                                                  local_1000._0_3_)))));
    local_fe0._0_3_ = CONCAT21(CONCAT11(cVar76,cVar76),cVar76);
    local_fe8._0_3_ = CONCAT21(CONCAT11(cVar76,cVar76),cVar76);
    vSaturationCheckMax[1] =
         CONCAT17(cVar76,CONCAT16(cVar76,CONCAT15(cVar76,CONCAT14(cVar76,CONCAT13(cVar76,local_fe8.
                                                                                         _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar76,CONCAT16(cVar76,CONCAT15(cVar76,CONCAT14(cVar76,CONCAT13(cVar76,local_fe0.
                                                                                         _0_3_)))));
    vMaxM[0] = lVar13;
    vMaxS[1] = lVar10;
    vMaxS[0] = lVar13;
    vMaxL[1] = lVar10;
    vMaxL[0] = lVar13;
    vPosMask[1] = lVar10;
    pvP._0_1_ = (char)iVar78;
    position._0_1_ = (char)iVar77;
    local_fa0[2] = (char)position;
    local_fa0[1] = (char)position;
    local_fa0[0] = (char)position;
    local_fa8[2] = (char)position;
    local_fa8[1] = (char)position;
    local_fa8[0] = (char)position;
    auVar74[3] = (char)position;
    auVar74._0_3_ = local_fa8._0_3_;
    auVar74[4] = (char)position;
    auVar74[5] = (char)position;
    auVar74[6] = (char)position;
    auVar74[0xb] = (char)position;
    auVar74._8_3_ = local_fa0._0_3_;
    auVar74[0xc] = (char)position;
    auVar74[0xd] = (char)position;
    auVar74[0xe] = (char)position;
    auVar74[7] = (char)position;
    vSegLenXgap[1] = CONCAT71(0,bVar75);
    local_f80[2] = -(char)position * (char)i;
    local_f80[1] = local_f80[2];
    local_f80[0] = local_f80[2];
    local_f88[2] = local_f80[2];
    local_f88[1] = local_f80[2];
    local_f88[0] = local_f80[2];
    auVar91[3] = local_f80[2];
    auVar91._0_3_ = local_f88._0_3_;
    auVar91[4] = local_f80[2];
    auVar91[5] = local_f80[2];
    auVar91[6] = local_f80[2];
    auVar91[0xb] = local_f80[2];
    auVar91._8_3_ = local_f80._0_3_;
    auVar91[0xc] = local_f80[2];
    auVar91[0xd] = local_f80[2];
    auVar91[0xe] = local_f80[2];
    auVar91[7] = local_f80[2];
    auVar90._8_8_ = 0;
    auVar90._0_8_ = vSegLenXgap[1];
    auVar91[0xf] = 0;
    auVar90 = paddsb(auVar90,auVar91 << 8);
    profile_local = (parasail_profile_t *)parasail_result_new_stats();
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x10110402;
      uVar80 = 0;
      if (s1_beg != 0) {
        uVar80 = 8;
      }
      *(uint *)&profile_local->field_0xc = uVar80 | *(uint *)&profile_local->field_0xc;
      uVar80 = 0;
      if (s1_end != 0) {
        uVar80 = 0x10;
      }
      *(uint *)&profile_local->field_0xc = uVar80 | *(uint *)&profile_local->field_0xc;
      uVar80 = 0;
      if (s2_beg != 0) {
        uVar80 = 0x4000;
      }
      *(uint *)&profile_local->field_0xc = uVar80 | *(uint *)&profile_local->field_0xc;
      uVar80 = 0;
      if (s2_end != 0) {
        uVar80 = 0x8000;
      }
      uVar80 = uVar80 | *(uint *)&profile_local->field_0xc;
      len = (size_t)uVar80;
      *(uint *)&profile_local->field_0xc = uVar80;
      b = parasail_memalign___m128i(0x10,(long)iVar77);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar77);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar77);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr = parasail_memalign___m128i(0x10,(long)iVar77);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar77);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar77);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar77);
      ptr_06 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar138[0] = (long)iVar77;
        alVar138[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar138,len);
        alVar139[0] = (long)iVar77;
        alVar139[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar139,len);
        alVar140[0] = (long)iVar77;
        alVar140[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar140,len);
        alVar141[0] = (long)iVar77;
        alVar141[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar141,len);
        c[0] = (long)iVar77;
        c[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c,len);
        c_00[0] = (long)iVar77;
        c_00[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_00,len);
        c_01[0] = (long)iVar77;
        c_01[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_01,len);
        auVar92._8_8_ = uVar11;
        auVar92._0_8_ = uVar8;
        register0x00001200 = psubsb(ZEXT816(0),auVar92);
        vGapperL[0] = 0x101010101010101;
        _segNum = 0x101010101010101;
        k = iVar77;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          auVar94._8_8_ = uVar12;
          auVar94._0_8_ = uVar9;
          register0x00001200 = psubsb(stack0xffffffffffffec88,auVar94);
          auVar93._8_8_ = 0x101010101010101;
          auVar93._0_8_ = 0x101010101010101;
          _segNum = paddsb(_segNum,auVar93);
        }
        local_138c = 0;
        for (k = 0; k < iVar77; k = k + 1) {
          for (local_1390 = 0; local_1390 < 0x10; local_1390 = local_1390 + 1) {
            if (s1_beg == 0) {
              local_16ac = -(gap * (local_1390 * iVar77 + k)) - open;
            }
            else {
              local_16ac = 0;
            }
            if (local_16ac < -0x80) {
              local_16ac = -0x80;
            }
            *(char *)((long)&tmp + (long)local_1390) = (char)local_16ac;
          }
          ptr[local_138c][0] = tmp;
          ptr[local_138c][1] = h.m[0];
          local_138c = local_138c + 1;
        }
        *ptr_06 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_16bc = -(gap * (k + -1)) - open;
          }
          else {
            local_16bc = 0;
          }
          if (local_16bc < -0x80) {
            local_16bc = -0x80;
          }
          ptr_06[k] = (int8_t)local_16bc;
        }
        vMaxM[1] = lVar10;
        vMaxH[0] = lVar13;
        vMaxH[1] = lVar10;
        vSaturationCheckMax[0] = lVar13;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar114 = ptr[iVar77 + -1][0];
          uVar113 = b_03[iVar77 + -1][0];
          uVar14 = b_04[iVar77 + -1][0];
          uVar15 = b_05[iVar77 + -1][0];
          vHpM[0] = b_03[iVar77 + -1][1] << 8 | uVar113 >> 0x38;
          vHpS[1] = uVar113 << 8;
          vHpS[0] = b_04[iVar77 + -1][1] << 8 | uVar14 >> 0x38;
          vHpL[1] = uVar14 << 8;
          vHpL[0] = b_05[iVar77 + -1][1] << 8 | uVar15 >> 0x38;
          pvW = (__m128i *)(uVar15 << 8);
          vHp[0] = ptr[iVar77 + -1][1] << 8 | uVar114 >> 0x38;
          vHpM[1] = uVar114 << 8 | (ulong)(byte)ptr_06[s1Len];
          iVar79 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar4->mapper[(byte)s2[s1Len]];
          auVar95._8_8_ = lVar13;
          auVar95._0_8_ = lVar10;
          register0x00001200 = psubsb(auVar95,(undefined1  [16])*ptr_04);
          vF[0] = lVar13;
          vF_ext[1] = lVar10;
          stack0xffffffffffffeb68 = ZEXT816(0);
          stack0xffffffffffffeb58 = ZEXT816(0);
          stack0xffffffffffffeb48 = ZEXT816(0);
          k = 0;
          while( true ) {
            auVar91 = stack0xffffffffffffebd8;
            local_6f8 = (char)vF_ext[1];
            cStack_6f7 = vF_ext[1]._1_1_;
            cStack_6f6 = vF_ext[1]._2_1_;
            cStack_6f5 = vF_ext[1]._3_1_;
            cStack_6f4 = vF_ext[1]._4_1_;
            cStack_6f3 = vF_ext[1]._5_1_;
            cStack_6f2 = vF_ext[1]._6_1_;
            cStack_6f1 = vF_ext[1]._7_1_;
            cStack_6f0 = (char)vF_ext[2];
            cStack_6ef = vF_ext[2]._1_1_;
            cStack_6ee = vF_ext[2]._2_1_;
            cStack_6ed = vF_ext[2]._3_1_;
            cStack_6ec = vF_ext[2]._4_1_;
            cStack_6eb = vF_ext[2]._5_1_;
            cStack_6ea = vF_ext[2]._6_1_;
            cStack_6e9 = vF_ext[2]._7_1_;
            if (iVar77 <= k) break;
            alVar138 = ptr[k];
            alVar139 = b_03[k];
            alVar140 = b_04[k];
            alVar141 = b_05[k];
            auVar31._8_8_ = uVar11;
            auVar31._0_8_ = uVar8;
            auVar91 = psubsb((undefined1  [16])ptr[k],auVar31);
            auVar30._8_8_ = uVar12;
            auVar30._0_8_ = uVar9;
            auVar92 = psubsb((undefined1  [16])b[k],auVar30);
            local_898 = auVar91[0];
            cStack_897 = auVar91[1];
            cStack_896 = auVar91[2];
            cStack_895 = auVar91[3];
            cStack_894 = auVar91[4];
            cStack_893 = auVar91[5];
            cStack_892 = auVar91[6];
            cStack_891 = auVar91[7];
            cStack_890 = auVar91[8];
            cStack_88f = auVar91[9];
            cStack_88e = auVar91[10];
            cStack_88d = auVar91[0xb];
            cStack_88c = auVar91[0xc];
            cStack_88b = auVar91[0xd];
            cStack_88a = auVar91[0xe];
            cStack_889 = auVar91[0xf];
            local_8a8 = auVar92[0];
            cStack_8a7 = auVar92[1];
            cStack_8a6 = auVar92[2];
            cStack_8a5 = auVar92[3];
            cStack_8a4 = auVar92[4];
            cStack_8a3 = auVar92[5];
            cStack_8a2 = auVar92[6];
            cStack_8a1 = auVar92[7];
            cStack_8a0 = auVar92[8];
            cStack_89f = auVar92[9];
            cStack_89e = auVar92[10];
            cStack_89d = auVar92[0xb];
            cStack_89c = auVar92[0xc];
            cStack_89b = auVar92[0xd];
            cStack_89a = auVar92[0xe];
            cStack_899 = auVar92[0xf];
            case2[1]._0_2_ = CONCAT11(-(cStack_8a7 < cStack_897),-(local_8a8 < local_898));
            case2[1]._0_3_ = CONCAT12(-(cStack_8a6 < cStack_896),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_8a5 < cStack_895),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_8a4 < cStack_894),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_8a3 < cStack_893),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_8a2 < cStack_892),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_8a1 < cStack_891),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_89f < cStack_88f),-(cStack_8a0 < cStack_890));
            case1[0]._0_3_ = CONCAT12(-(cStack_89e < cStack_88e),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_89d < cStack_88d),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_89c < cStack_88c),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_89b < cStack_88b),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_89a < cStack_88a),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_899 < cStack_889),(undefined7)case1[0]);
            bVar82 = (local_898 < local_8a8) * local_8a8 | (local_898 >= local_8a8) * local_898;
            bVar96 = (cStack_897 < cStack_8a7) * cStack_8a7 |
                     (cStack_897 >= cStack_8a7) * cStack_897;
            bVar98 = (cStack_896 < cStack_8a6) * cStack_8a6 |
                     (cStack_896 >= cStack_8a6) * cStack_896;
            bVar100 = (cStack_895 < cStack_8a5) * cStack_8a5 |
                      (cStack_895 >= cStack_8a5) * cStack_895;
            bVar102 = (cStack_894 < cStack_8a4) * cStack_8a4 |
                      (cStack_894 >= cStack_8a4) * cStack_894;
            bVar104 = (cStack_893 < cStack_8a3) * cStack_8a3 |
                      (cStack_893 >= cStack_8a3) * cStack_893;
            bVar106 = (cStack_892 < cStack_8a2) * cStack_8a2 |
                      (cStack_892 >= cStack_8a2) * cStack_892;
            bVar108 = (cStack_891 < cStack_8a1) * cStack_8a1 |
                      (cStack_891 >= cStack_8a1) * cStack_891;
            bVar110 = (cStack_890 < cStack_8a0) * cStack_8a0 |
                      (cStack_890 >= cStack_8a0) * cStack_890;
            bVar115 = (cStack_88f < cStack_89f) * cStack_89f |
                      (cStack_88f >= cStack_89f) * cStack_88f;
            bVar118 = (cStack_88e < cStack_89e) * cStack_89e |
                      (cStack_88e >= cStack_89e) * cStack_88e;
            bVar121 = (cStack_88d < cStack_89d) * cStack_89d |
                      (cStack_88d >= cStack_89d) * cStack_88d;
            bVar124 = (cStack_88c < cStack_89c) * cStack_89c |
                      (cStack_88c >= cStack_89c) * cStack_88c;
            bVar127 = (cStack_88b < cStack_89b) * cStack_89b |
                      (cStack_88b >= cStack_89b) * cStack_88b;
            bVar130 = (cStack_88a < cStack_89a) * cStack_89a |
                      (cStack_88a >= cStack_89a) * cStack_88a;
            bVar133 = (cStack_889 < cStack_899) * cStack_899 |
                      (cStack_889 >= cStack_899) * cStack_889;
            vE_ext[1] = CONCAT17(bVar108,CONCAT16(bVar106,CONCAT15(bVar104,CONCAT14(bVar102,CONCAT13
                                                  (bVar100,CONCAT12(bVar98,CONCAT11(bVar96,bVar82)))
                                                  ))));
            vE[0] = CONCAT17(bVar133,CONCAT16(bVar130,CONCAT15(bVar127,CONCAT14(bVar124,CONCAT13(
                                                  bVar121,CONCAT12(bVar118,CONCAT11(bVar115,bVar110)
                                                                  ))))));
            auVar71._8_8_ = case1[0];
            auVar71._0_8_ = case2[1];
            auVar136 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])b_03[k],auVar71);
            auVar70._8_8_ = case1[0];
            auVar70._0_8_ = case2[1];
            auVar137 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])b_04[k],auVar70);
            auVar69._8_8_ = case1[0];
            auVar69._0_8_ = case2[1];
            auVar91 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])b_05[k],auVar69);
            auVar26._8_8_ = 0x101010101010101;
            auVar26._0_8_ = 0x101010101010101;
            auVar91 = paddsb(auVar91,auVar26);
            auVar92 = paddsb(stack0xffffffffffffebd8,(undefined1  [16])ptr_04[k]);
            local_8c8 = auVar92[0];
            cStack_8c7 = auVar92[1];
            cStack_8c6 = auVar92[2];
            cStack_8c5 = auVar92[3];
            cStack_8c4 = auVar92[4];
            cStack_8c3 = auVar92[5];
            cStack_8c2 = auVar92[6];
            cStack_8c1 = auVar92[7];
            cStack_8c0 = auVar92[8];
            cStack_8bf = auVar92[9];
            cStack_8be = auVar92[10];
            cStack_8bd = auVar92[0xb];
            cStack_8bc = auVar92[0xc];
            cStack_8bb = auVar92[0xd];
            cStack_8ba = auVar92[0xe];
            cStack_8b9 = auVar92[0xf];
            uVar114 = CONCAT17(-(cStack_8c1 < cStack_6f1),
                               CONCAT16(-(cStack_8c2 < cStack_6f2),
                                        CONCAT15(-(cStack_8c3 < cStack_6f3),
                                                 CONCAT14(-(cStack_8c4 < cStack_6f4),
                                                          CONCAT13(-(cStack_8c5 < cStack_6f5),
                                                                   CONCAT12(-(cStack_8c6 <
                                                                             cStack_6f6),
                                                                            CONCAT11(-(cStack_8c7 <
                                                                                      cStack_6f7),
                                                                                     -(local_8c8 <
                                                                                      local_6f8)))))
                                                ))) |
                      CONCAT17(-(cStack_6f1 == cStack_8c1),
                               CONCAT16(-(cStack_6f2 == cStack_8c2),
                                        CONCAT15(-(cStack_6f3 == cStack_8c3),
                                                 CONCAT14(-(cStack_6f4 == cStack_8c4),
                                                          CONCAT13(-(cStack_6f5 == cStack_8c5),
                                                                   CONCAT12(-(cStack_6f6 ==
                                                                             cStack_8c6),
                                                                            CONCAT11(-(cStack_6f7 ==
                                                                                      cStack_8c7),
                                                                                     -(local_6f8 ==
                                                                                      local_8c8)))))
                                                )));
            uVar113 = CONCAT17(-(cStack_8b9 < cStack_6e9),
                               CONCAT16(-(cStack_8ba < cStack_6ea),
                                        CONCAT15(-(cStack_8bb < cStack_6eb),
                                                 CONCAT14(-(cStack_8bc < cStack_6ec),
                                                          CONCAT13(-(cStack_8bd < cStack_6ed),
                                                                   CONCAT12(-(cStack_8be <
                                                                             cStack_6ee),
                                                                            CONCAT11(-(cStack_8bf <
                                                                                      cStack_6ef),
                                                                                     -(cStack_8c0 <
                                                                                      cStack_6f0))))
                                                         )))) |
                      CONCAT17(-(cStack_6e9 == cStack_8b9),
                               CONCAT16(-(cStack_6ea == cStack_8ba),
                                        CONCAT15(-(cStack_6eb == cStack_8bb),
                                                 CONCAT14(-(cStack_6ec == cStack_8bc),
                                                          CONCAT13(-(cStack_6ed == cStack_8bd),
                                                                   CONCAT12(-(cStack_6ee ==
                                                                             cStack_8be),
                                                                            CONCAT11(-(cStack_6ef ==
                                                                                      cStack_8bf),
                                                                                     -(cStack_6f0 ==
                                                                                      cStack_8c0))))
                                                         ))));
            vF_ext[1]._0_2_ =
                 CONCAT11((cStack_6f7 < cStack_8c7) * cStack_8c7 |
                          (cStack_6f7 >= cStack_8c7) * cStack_6f7,
                          (local_6f8 < local_8c8) * local_8c8 | (local_6f8 >= local_8c8) * local_6f8
                         );
            vF_ext[1]._0_3_ =
                 CONCAT12((cStack_6f6 < cStack_8c6) * cStack_8c6 |
                          (cStack_6f6 >= cStack_8c6) * cStack_6f6,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ =
                 CONCAT13((cStack_6f5 < cStack_8c5) * cStack_8c5 |
                          (cStack_6f5 >= cStack_8c5) * cStack_6f5,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ =
                 CONCAT14((cStack_6f4 < cStack_8c4) * cStack_8c4 |
                          (cStack_6f4 >= cStack_8c4) * cStack_6f4,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ =
                 CONCAT15((cStack_6f3 < cStack_8c3) * cStack_8c3 |
                          (cStack_6f3 >= cStack_8c3) * cStack_6f3,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ =
                 CONCAT16((cStack_6f2 < cStack_8c2) * cStack_8c2 |
                          (cStack_6f2 >= cStack_8c2) * cStack_6f2,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17((cStack_6f1 < cStack_8c1) * cStack_8c1 |
                                 (cStack_6f1 >= cStack_8c1) * cStack_6f1,(undefined7)vF_ext[1]);
            vF[0]._0_1_ = (cStack_6f0 < cStack_8c0) * cStack_8c0 |
                          (cStack_6f0 >= cStack_8c0) * cStack_6f0;
            vF[0]._1_1_ = (cStack_6ef < cStack_8bf) * cStack_8bf |
                          (cStack_6ef >= cStack_8bf) * cStack_6ef;
            vF[0]._2_1_ = (cStack_6ee < cStack_8be) * cStack_8be |
                          (cStack_6ee >= cStack_8be) * cStack_6ee;
            vF[0]._3_1_ = (cStack_6ed < cStack_8bd) * cStack_8bd |
                          (cStack_6ed >= cStack_8bd) * cStack_6ed;
            vF[0]._4_1_ = (cStack_6ec < cStack_8bc) * cStack_8bc |
                          (cStack_6ec >= cStack_8bc) * cStack_6ec;
            vF[0]._5_1_ = (cStack_6eb < cStack_8bb) * cStack_8bb |
                          (cStack_6eb >= cStack_8bb) * cStack_6eb;
            vF[0]._6_1_ = (cStack_6ea < cStack_8ba) * cStack_8ba |
                          (cStack_6ea >= cStack_8ba) * cStack_6ea;
            vF[0]._7_1_ = (cStack_6e9 < cStack_8b9) * cStack_8b9 |
                          (cStack_6e9 >= cStack_8b9) * cStack_6e9;
            auVar68._8_8_ = uVar113;
            auVar68._0_8_ = uVar114;
            register0x00001240 = pblendvb(stack0xffffffffffffebc8,stack0xffffffffffffeb68,auVar68);
            auVar67._8_8_ = uVar113;
            auVar67._0_8_ = uVar114;
            register0x00001240 = pblendvb(stack0xffffffffffffebb8,stack0xffffffffffffeb58,auVar67);
            auVar92 = paddsb(stack0xffffffffffffeba8,(undefined1  [16])ptr_05[k]);
            auVar66._8_8_ = uVar113;
            auVar66._0_8_ = uVar114;
            register0x00001240 = pblendvb(auVar92,stack0xffffffffffffeb48,auVar66);
            auVar92 = paddsb((undefined1  [16])stack0xffffffffffffeaf8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar79 * iVar77) * 0x10));
            auVar93 = paddsb((undefined1  [16])stack0xffffffffffffeae8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar77) * 0x10));
            auVar94 = paddsb((undefined1  [16])stack0xffffffffffffead8,
                             *(undefined1 (*) [16])
                              ((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar77) * 0x10));
            auVar25._8_8_ = 0x101010101010101;
            auVar25._0_8_ = 0x101010101010101;
            auVar95 = paddsb((undefined1  [16])_pvW,auVar25);
            vHpM[1] = auVar92._0_8_;
            vHp[0] = auVar92._8_8_;
            local_8e8 = auVar92[0];
            cStack_8e7 = auVar92[1];
            cStack_8e6 = auVar92[2];
            cStack_8e5 = auVar92[3];
            cStack_8e4 = auVar92[4];
            cStack_8e3 = auVar92[5];
            cStack_8e2 = auVar92[6];
            cStack_8e1 = auVar92[7];
            cStack_8e0 = auVar92[8];
            cStack_8df = auVar92[9];
            cStack_8de = auVar92[10];
            cStack_8dd = auVar92[0xb];
            cStack_8dc = auVar92[0xc];
            cStack_8db = auVar92[0xd];
            cStack_8da = auVar92[0xe];
            cStack_8d9 = auVar92[0xf];
            case2[1]._0_2_ = CONCAT11(-(cStack_8e7 < (char)bVar96),-(local_8e8 < (char)bVar82));
            case2[1]._0_3_ = CONCAT12(-(cStack_8e6 < (char)bVar98),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_8e5 < (char)bVar100),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_8e4 < (char)bVar102),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_8e3 < (char)bVar104),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_8e2 < (char)bVar106),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_8e1 < (char)bVar108),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_8df < (char)bVar115),-(cStack_8e0 < (char)bVar110));
            case1[0]._0_3_ = CONCAT12(-(cStack_8de < (char)bVar118),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_8dd < (char)bVar121),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_8dc < (char)bVar124),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_8db < (char)bVar127),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_8da < (char)bVar130),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_8d9 < (char)bVar133),(undefined7)case1[0]);
            vHtM[1] = CONCAT17(((char)bVar108 < cStack_8e1) * cStack_8e1 |
                               ((char)bVar108 >= cStack_8e1) * bVar108,
                               CONCAT16(((char)bVar106 < cStack_8e2) * cStack_8e2 |
                                        ((char)bVar106 >= cStack_8e2) * bVar106,
                                        CONCAT15(((char)bVar104 < cStack_8e3) * cStack_8e3 |
                                                 ((char)bVar104 >= cStack_8e3) * bVar104,
                                                 CONCAT14(((char)bVar102 < cStack_8e4) * cStack_8e4
                                                          | ((char)bVar102 >= cStack_8e4) * bVar102,
                                                          CONCAT13(((char)bVar100 < cStack_8e5) *
                                                                   cStack_8e5 |
                                                                   ((char)bVar100 >= cStack_8e5) *
                                                                   bVar100,CONCAT12(((char)bVar98 <
                                                                                    cStack_8e6) *
                                                                                    cStack_8e6 |
                                                                                    ((char)bVar98 >=
                                                                                    cStack_8e6) *
                                                                                    bVar98,CONCAT11(
                                                  ((char)bVar96 < cStack_8e7) * cStack_8e7 |
                                                  ((char)bVar96 >= cStack_8e7) * bVar96,
                                                  ((char)bVar82 < local_8e8) * local_8e8 |
                                                  ((char)bVar82 >= local_8e8) * bVar82)))))));
            vHt[0]._0_1_ = ((char)bVar110 < cStack_8e0) * cStack_8e0 |
                           ((char)bVar110 >= cStack_8e0) * bVar110;
            vHt[0]._1_1_ = ((char)bVar115 < cStack_8df) * cStack_8df |
                           ((char)bVar115 >= cStack_8df) * bVar115;
            vHt[0]._2_1_ = ((char)bVar118 < cStack_8de) * cStack_8de |
                           ((char)bVar118 >= cStack_8de) * bVar118;
            vHt[0]._3_1_ = ((char)bVar121 < cStack_8dd) * cStack_8dd |
                           ((char)bVar121 >= cStack_8dd) * bVar121;
            vHt[0]._4_1_ = ((char)bVar124 < cStack_8dc) * cStack_8dc |
                           ((char)bVar124 >= cStack_8dc) * bVar124;
            vHt[0]._5_1_ = ((char)bVar127 < cStack_8db) * cStack_8db |
                           ((char)bVar127 >= cStack_8db) * bVar127;
            vHt[0]._6_1_ = ((char)bVar130 < cStack_8da) * cStack_8da |
                           ((char)bVar130 >= cStack_8da) * bVar130;
            vHt[0]._7_1_ = ((char)bVar133 < cStack_8d9) * cStack_8d9 |
                           ((char)bVar133 >= cStack_8d9) * bVar133;
            vHpS[1] = auVar93._0_8_;
            vHpM[0] = auVar93._8_8_;
            vES[1] = auVar136._0_8_;
            vEM[0] = auVar136._8_8_;
            auVar65._8_8_ = case1[0];
            auVar65._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar93,auVar136,auVar65);
            vHpL[1] = auVar94._0_8_;
            vHpS[0] = auVar94._8_8_;
            vEL[1] = auVar137._0_8_;
            vES[0] = auVar137._8_8_;
            auVar64._8_8_ = case1[0];
            auVar64._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar94,auVar137,auVar64);
            pvW = auVar95._0_8_;
            vHpL[0] = auVar95._8_8_;
            vHt[1] = auVar91._0_8_;
            vEL[0] = auVar91._8_8_;
            auVar63._8_8_ = case1[0];
            auVar63._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar95,auVar91,auVar63);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            _pvW = alVar141;
            unique0x10009138 = alVar140;
            unique0x10009158 = alVar139;
            unique0x10009178 = alVar138;
          }
          uVar114 = vHt[0] << 8 | (ulong)vHtM[1] >> 0x38;
          vHt[0] = uVar114;
          vHtM[1] = vHtM[1] << 8;
          lVar84 = vHtS[1] << 8;
          vHtM[0] = vHtM[0] << 8 | (ulong)vHtS[1] >> 0x38;
          vHtS[1] = lVar84;
          lVar85 = vHtL[1] << 8;
          vHtS[0] = vHtS[0] << 8 | (ulong)vHtL[1] >> 0x38;
          vHtL[1] = lVar85;
          lVar86 = vF[1] << 8;
          vHtL[0] = vHtL[0] << 8 | (ulong)vF[1] >> 0x38;
          vF[1] = lVar86;
          cVar83 = ptr_06[(long)s1Len + 1];
          vHtM[1]._0_1_ = cVar83;
          auVar137._8_8_ = uVar114;
          auVar137._0_8_ = vHtM[1];
          auVar92 = paddsb(auVar137,(undefined1  [16])*ptr_04);
          local_8f8 = auVar92[0];
          cStack_8f7 = auVar92[1];
          cStack_8f6 = auVar92[2];
          cStack_8f5 = auVar92[3];
          cStack_8f4 = auVar92[4];
          cStack_8f3 = auVar92[5];
          cStack_8f2 = auVar92[6];
          cStack_8f1 = auVar92[7];
          cStack_8f0 = auVar92[8];
          cStack_8ef = auVar92[9];
          cStack_8ee = auVar92[10];
          cStack_8ed = auVar92[0xb];
          cStack_8ec = auVar92[0xc];
          cStack_8eb = auVar92[0xd];
          cStack_8ea = auVar92[0xe];
          cStack_8e9 = auVar92[0xf];
          uVar114 = CONCAT17(-(cStack_6f1 < cStack_8f1),
                             CONCAT16(-(cStack_6f2 < cStack_8f2),
                                      CONCAT15(-(cStack_6f3 < cStack_8f3),
                                               CONCAT14(-(cStack_6f4 < cStack_8f4),
                                                        CONCAT13(-(cStack_6f5 < cStack_8f5),
                                                                 CONCAT12(-(cStack_6f6 < cStack_8f6)
                                                                          ,CONCAT11(-(cStack_6f7 <
                                                                                     cStack_8f7),
                                                                                    -(local_6f8 <
                                                                                     local_8f8))))))
                                     )) |
                    CONCAT17(-(cStack_8f1 == cStack_6f1),
                             CONCAT16(-(cStack_8f2 == cStack_6f2),
                                      CONCAT15(-(cStack_8f3 == cStack_6f3),
                                               CONCAT14(-(cStack_8f4 == cStack_6f4),
                                                        CONCAT13(-(cStack_8f5 == cStack_6f5),
                                                                 CONCAT12(-(cStack_8f6 == cStack_6f6
                                                                           ),CONCAT11(-(cStack_8f7
                                                                                       == cStack_6f7
                                                                                       ),-(local_8f8
                                                                                          == 
                                                  local_6f8))))))));
          uVar113 = CONCAT17(-(cStack_6e9 < cStack_8e9),
                             CONCAT16(-(cStack_6ea < cStack_8ea),
                                      CONCAT15(-(cStack_6eb < cStack_8eb),
                                               CONCAT14(-(cStack_6ec < cStack_8ec),
                                                        CONCAT13(-(cStack_6ed < cStack_8ed),
                                                                 CONCAT12(-(cStack_6ee < cStack_8ee)
                                                                          ,CONCAT11(-(cStack_6ef <
                                                                                     cStack_8ef),
                                                                                    -(cStack_6f0 <
                                                                                     cStack_8f0)))))
                                              ))) |
                    CONCAT17(-(cStack_8e9 == cStack_6e9),
                             CONCAT16(-(cStack_8ea == cStack_6ea),
                                      CONCAT15(-(cStack_8eb == cStack_6eb),
                                               CONCAT14(-(cStack_8ec == cStack_6ec),
                                                        CONCAT13(-(cStack_8ed == cStack_6ed),
                                                                 CONCAT12(-(cStack_8ee == cStack_6ee
                                                                           ),CONCAT11(-(cStack_8ef
                                                                                       == cStack_6ef
                                                                                       ),-(
                                                  cStack_8f0 == cStack_6f0))))))));
          vF_ext[1]._0_2_ =
               CONCAT11((cStack_6f7 < cStack_8f7) * cStack_8f7 |
                        (cStack_6f7 >= cStack_8f7) * cStack_6f7,
                        (local_6f8 < local_8f8) * local_8f8 | (local_6f8 >= local_8f8) * local_6f8);
          vF_ext[1]._0_3_ =
               CONCAT12((cStack_6f6 < cStack_8f6) * cStack_8f6 |
                        (cStack_6f6 >= cStack_8f6) * cStack_6f6,(undefined2)vF_ext[1]);
          vF_ext[1]._0_4_ =
               CONCAT13((cStack_6f5 < cStack_8f5) * cStack_8f5 |
                        (cStack_6f5 >= cStack_8f5) * cStack_6f5,(undefined3)vF_ext[1]);
          vF_ext[1]._0_5_ =
               CONCAT14((cStack_6f4 < cStack_8f4) * cStack_8f4 |
                        (cStack_6f4 >= cStack_8f4) * cStack_6f4,(undefined4)vF_ext[1]);
          vF_ext[1]._0_6_ =
               CONCAT15((cStack_6f3 < cStack_8f3) * cStack_8f3 |
                        (cStack_6f3 >= cStack_8f3) * cStack_6f3,(undefined5)vF_ext[1]);
          vF_ext[1]._0_7_ =
               CONCAT16((cStack_6f2 < cStack_8f2) * cStack_8f2 |
                        (cStack_6f2 >= cStack_8f2) * cStack_6f2,(undefined6)vF_ext[1]);
          vF_ext[1] = CONCAT17((cStack_6f1 < cStack_8f1) * cStack_8f1 |
                               (cStack_6f1 >= cStack_8f1) * cStack_6f1,(undefined7)vF_ext[1]);
          vF[0]._0_1_ = (cStack_6f0 < cStack_8f0) * cStack_8f0 |
                        (cStack_6f0 >= cStack_8f0) * cStack_6f0;
          vF[0]._1_1_ = (cStack_6ef < cStack_8ef) * cStack_8ef |
                        (cStack_6ef >= cStack_8ef) * cStack_6ef;
          vF[0]._2_1_ = (cStack_6ee < cStack_8ee) * cStack_8ee |
                        (cStack_6ee >= cStack_8ee) * cStack_6ee;
          vF[0]._3_1_ = (cStack_6ed < cStack_8ed) * cStack_8ed |
                        (cStack_6ed >= cStack_8ed) * cStack_6ed;
          vF[0]._4_1_ = (cStack_6ec < cStack_8ec) * cStack_8ec |
                        (cStack_6ec >= cStack_8ec) * cStack_6ec;
          vF[0]._5_1_ = (cStack_6eb < cStack_8eb) * cStack_8eb |
                        (cStack_6eb >= cStack_8eb) * cStack_6eb;
          vF[0]._6_1_ = (cStack_6ea < cStack_8ea) * cStack_8ea |
                        (cStack_6ea >= cStack_8ea) * cStack_6ea;
          vF[0]._7_1_ = (cStack_6e9 < cStack_8e9) * cStack_8e9 |
                        (cStack_6e9 >= cStack_8e9) * cStack_6e9;
          auVar62._8_8_ = vHtM[0];
          auVar62._0_8_ = lVar84;
          auVar61._8_8_ = uVar113;
          auVar61._0_8_ = uVar114;
          register0x00001240 = pblendvb(stack0xffffffffffffeb68,auVar62,auVar61);
          auVar60._8_8_ = vHtS[0];
          auVar60._0_8_ = lVar85;
          auVar59._8_8_ = uVar113;
          auVar59._0_8_ = uVar114;
          register0x00001240 = pblendvb(stack0xffffffffffffeb58,auVar60,auVar59);
          auVar136._8_8_ = vHtL[0];
          auVar136._0_8_ = lVar86;
          auVar92 = paddsb(auVar136,(undefined1  [16])*ptr_05);
          auVar58._8_8_ = uVar113;
          auVar58._0_8_ = uVar114;
          register0x00001240 = pblendvb(stack0xffffffffffffeb48,auVar92,auVar58);
          k = 0;
          while( true ) {
            if (0xd < k) break;
            auVar24._8_8_ = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
            auVar24._0_8_ = vF_ext[1] << 8;
            auVar92 = paddsb(auVar24,auVar90);
            local_918 = auVar92[0];
            cStack_917 = auVar92[1];
            cStack_916 = auVar92[2];
            cStack_915 = auVar92[3];
            cStack_914 = auVar92[4];
            cStack_913 = auVar92[5];
            cStack_912 = auVar92[6];
            cStack_911 = auVar92[7];
            cStack_910 = auVar92[8];
            cStack_90f = auVar92[9];
            cStack_90e = auVar92[10];
            cStack_90d = auVar92[0xb];
            cStack_90c = auVar92[0xc];
            cStack_90b = auVar92[0xd];
            cStack_90a = auVar92[0xe];
            cStack_909 = auVar92[0xf];
            local_928 = (char)vF_ext[1];
            cStack_927 = vF_ext[1]._1_1_;
            cStack_926 = vF_ext[1]._2_1_;
            cStack_925 = vF_ext[1]._3_1_;
            cStack_924 = vF_ext[1]._4_1_;
            cStack_923 = vF_ext[1]._5_1_;
            cStack_922 = vF_ext[1]._6_1_;
            cStack_921 = vF_ext[1]._7_1_;
            cStack_920 = (char)vF_ext[2];
            cStack_91f = vF_ext[2]._1_1_;
            cStack_91e = vF_ext[2]._2_1_;
            cStack_91d = vF_ext[2]._3_1_;
            cStack_91c = vF_ext[2]._4_1_;
            cStack_91b = vF_ext[2]._5_1_;
            cStack_91a = vF_ext[2]._6_1_;
            cStack_919 = vF_ext[2]._7_1_;
            uVar114 = CONCAT17(-(cStack_921 < cStack_911),
                               CONCAT16(-(cStack_922 < cStack_912),
                                        CONCAT15(-(cStack_923 < cStack_913),
                                                 CONCAT14(-(cStack_924 < cStack_914),
                                                          CONCAT13(-(cStack_925 < cStack_915),
                                                                   CONCAT12(-(cStack_926 <
                                                                             cStack_916),
                                                                            CONCAT11(-(cStack_927 <
                                                                                      cStack_917),
                                                                                     -(local_928 <
                                                                                      local_918)))))
                                                ))) |
                      CONCAT17(-(cStack_911 == cStack_921),
                               CONCAT16(-(cStack_912 == cStack_922),
                                        CONCAT15(-(cStack_913 == cStack_923),
                                                 CONCAT14(-(cStack_914 == cStack_924),
                                                          CONCAT13(-(cStack_915 == cStack_925),
                                                                   CONCAT12(-(cStack_916 ==
                                                                             cStack_926),
                                                                            CONCAT11(-(cStack_917 ==
                                                                                      cStack_927),
                                                                                     -(local_918 ==
                                                                                      local_928)))))
                                                )));
            uVar113 = CONCAT17(-(cStack_919 < cStack_909),
                               CONCAT16(-(cStack_91a < cStack_90a),
                                        CONCAT15(-(cStack_91b < cStack_90b),
                                                 CONCAT14(-(cStack_91c < cStack_90c),
                                                          CONCAT13(-(cStack_91d < cStack_90d),
                                                                   CONCAT12(-(cStack_91e <
                                                                             cStack_90e),
                                                                            CONCAT11(-(cStack_91f <
                                                                                      cStack_90f),
                                                                                     -(cStack_920 <
                                                                                      cStack_910))))
                                                         )))) |
                      CONCAT17(-(cStack_909 == cStack_919),
                               CONCAT16(-(cStack_90a == cStack_91a),
                                        CONCAT15(-(cStack_90b == cStack_91b),
                                                 CONCAT14(-(cStack_90c == cStack_91c),
                                                          CONCAT13(-(cStack_90d == cStack_91d),
                                                                   CONCAT12(-(cStack_90e ==
                                                                             cStack_91e),
                                                                            CONCAT11(-(cStack_90f ==
                                                                                      cStack_91f),
                                                                                     -(cStack_910 ==
                                                                                      cStack_920))))
                                                         ))));
            vF_ext[1]._0_2_ =
                 CONCAT11((cStack_927 < cStack_917) * cStack_917 |
                          (cStack_927 >= cStack_917) * cStack_927,
                          (local_928 < local_918) * local_918 | (local_928 >= local_918) * local_928
                         );
            vF_ext[1]._0_3_ =
                 CONCAT12((cStack_926 < cStack_916) * cStack_916 |
                          (cStack_926 >= cStack_916) * cStack_926,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ =
                 CONCAT13((cStack_925 < cStack_915) * cStack_915 |
                          (cStack_925 >= cStack_915) * cStack_925,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ =
                 CONCAT14((cStack_924 < cStack_914) * cStack_914 |
                          (cStack_924 >= cStack_914) * cStack_924,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ =
                 CONCAT15((cStack_923 < cStack_913) * cStack_913 |
                          (cStack_923 >= cStack_913) * cStack_923,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ =
                 CONCAT16((cStack_922 < cStack_912) * cStack_912 |
                          (cStack_922 >= cStack_912) * cStack_922,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17((cStack_921 < cStack_911) * cStack_911 |
                                 (cStack_921 >= cStack_911) * cStack_921,(undefined7)vF_ext[1]);
            vF[0]._0_1_ = (cStack_920 < cStack_910) * cStack_910 |
                          (cStack_920 >= cStack_910) * cStack_920;
            vF[0]._1_1_ = (cStack_91f < cStack_90f) * cStack_90f |
                          (cStack_91f >= cStack_90f) * cStack_91f;
            vF[0]._2_1_ = (cStack_91e < cStack_90e) * cStack_90e |
                          (cStack_91e >= cStack_90e) * cStack_91e;
            vF[0]._3_1_ = (cStack_91d < cStack_90d) * cStack_90d |
                          (cStack_91d >= cStack_90d) * cStack_91d;
            vF[0]._4_1_ = (cStack_91c < cStack_90c) * cStack_90c |
                          (cStack_91c >= cStack_90c) * cStack_91c;
            vF[0]._5_1_ = (cStack_91b < cStack_90b) * cStack_90b |
                          (cStack_91b >= cStack_90b) * cStack_91b;
            vF[0]._6_1_ = (cStack_91a < cStack_90a) * cStack_90a |
                          (cStack_91a >= cStack_90a) * cStack_91a;
            vF[0]._7_1_ = (cStack_919 < cStack_909) * cStack_909 |
                          (cStack_919 >= cStack_909) * cStack_919;
            auVar57._8_8_ = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
            auVar57._0_8_ = vFS[1] << 8;
            auVar56._8_8_ = uVar113;
            auVar56._0_8_ = uVar114;
            register0x00001240 = pblendvb(stack0xffffffffffffeb68,auVar57,auVar56);
            auVar55._8_8_ = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
            auVar55._0_8_ = vFL[1] << 8;
            auVar54._8_8_ = uVar113;
            auVar54._0_8_ = uVar114;
            register0x00001240 = pblendvb(stack0xffffffffffffeb58,auVar55,auVar54);
            auVar23._8_8_ = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
            auVar23._0_8_ = vH[1] << 8;
            auVar74[0xf] = 0;
            auVar92 = paddsb(auVar23,auVar74 << 8);
            auVar53._8_8_ = uVar113;
            auVar53._0_8_ = uVar114;
            register0x00001240 = pblendvb(stack0xffffffffffffeb48,auVar92,auVar53);
            k = k + 1;
          }
          lVar87 = vFS[1] << 8;
          vFM[0] = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
          vFS[1] = lVar87;
          lVar88 = vFL[1] << 8;
          vFS[0] = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
          vFL[1] = lVar88;
          lVar89 = vH[1] << 8;
          vFL[0] = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
          vH[1] = lVar89;
          auVar22._8_8_ = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
          auVar22._0_8_ = vF_ext[1] << 8;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsb(auVar22,auVar21);
          local_938 = (char)vF_ext[1];
          cStack_937 = vF_ext[1]._1_1_;
          cStack_936 = vF_ext[1]._2_1_;
          cStack_935 = vF_ext[1]._3_1_;
          cStack_934 = vF_ext[1]._4_1_;
          cStack_933 = vF_ext[1]._5_1_;
          cStack_932 = vF_ext[1]._6_1_;
          cStack_931 = vF_ext[1]._7_1_;
          cStack_930 = (char)vF_ext[2];
          cStack_92f = vF_ext[2]._1_1_;
          cStack_92e = vF_ext[2]._2_1_;
          cStack_92d = vF_ext[2]._3_1_;
          cStack_92c = vF_ext[2]._4_1_;
          cStack_92b = vF_ext[2]._5_1_;
          cStack_92a = vF_ext[2]._6_1_;
          cStack_929 = vF_ext[2]._7_1_;
          cStack_947 = auVar91[0];
          cStack_946 = auVar91[1];
          cStack_945 = auVar91[2];
          cStack_944 = auVar91[3];
          cStack_943 = auVar91[4];
          cStack_942 = auVar91[5];
          cStack_941 = auVar91[6];
          cStack_940 = auVar91[7];
          cStack_93f = auVar91[8];
          cStack_93e = auVar91[9];
          cStack_93d = auVar91[10];
          cStack_93c = auVar91[0xb];
          cStack_93b = auVar91[0xc];
          cStack_93a = auVar91[0xd];
          cStack_939 = auVar91[0xe];
          case2[1]._0_2_ = CONCAT11(-(cStack_947 < cStack_937),-(cVar83 < local_938));
          case2[1]._0_3_ = CONCAT12(-(cStack_946 < cStack_936),(undefined2)case2[1]);
          case2[1]._0_4_ = CONCAT13(-(cStack_945 < cStack_935),(undefined3)case2[1]);
          case2[1]._0_5_ = CONCAT14(-(cStack_944 < cStack_934),(undefined4)case2[1]);
          case2[1]._0_6_ = CONCAT15(-(cStack_943 < cStack_933),(undefined5)case2[1]);
          case2[1]._0_7_ = CONCAT16(-(cStack_942 < cStack_932),(undefined6)case2[1]);
          case2[1] = CONCAT17(-(cStack_941 < cStack_931),(undefined7)case2[1]);
          case1[0]._0_2_ = CONCAT11(-(cStack_93f < cStack_92f),-(cStack_940 < cStack_930));
          case1[0]._0_3_ = CONCAT12(-(cStack_93e < cStack_92e),(undefined2)case1[0]);
          case1[0]._0_4_ = CONCAT13(-(cStack_93d < cStack_92d),(undefined3)case1[0]);
          case1[0]._0_5_ = CONCAT14(-(cStack_93c < cStack_92c),(undefined4)case1[0]);
          case1[0]._0_6_ = CONCAT15(-(cStack_93b < cStack_92b),(undefined5)case1[0]);
          case1[0]._0_7_ = CONCAT16(-(cStack_93a < cStack_92a),(undefined6)case1[0]);
          case1[0] = CONCAT17(-(cStack_939 < cStack_929),(undefined7)case1[0]);
          vHM[1]._0_2_ = CONCAT11((cStack_937 < cStack_947) * cStack_947 |
                                  (cStack_937 >= cStack_947) * cStack_937,
                                  (local_938 < cVar83) * cVar83 | (local_938 >= cVar83) * local_938)
          ;
          vHM[1]._0_3_ = CONCAT12((cStack_936 < cStack_946) * cStack_946 |
                                  (cStack_936 >= cStack_946) * cStack_936,(undefined2)vHM[1]);
          vHM[1]._0_4_ = CONCAT13((cStack_935 < cStack_945) * cStack_945 |
                                  (cStack_935 >= cStack_945) * cStack_935,(undefined3)vHM[1]);
          vHM[1]._0_5_ = CONCAT14((cStack_934 < cStack_944) * cStack_944 |
                                  (cStack_934 >= cStack_944) * cStack_934,(undefined4)vHM[1]);
          vHM[1]._0_6_ = CONCAT15((cStack_933 < cStack_943) * cStack_943 |
                                  (cStack_933 >= cStack_943) * cStack_933,(undefined5)vHM[1]);
          vHM[1]._0_7_ = CONCAT16((cStack_932 < cStack_942) * cStack_942 |
                                  (cStack_932 >= cStack_942) * cStack_932,(undefined6)vHM[1]);
          vHM[1] = CONCAT17((cStack_931 < cStack_941) * cStack_941 |
                            (cStack_931 >= cStack_941) * cStack_931,(undefined7)vHM[1]);
          vH[0]._0_2_ = CONCAT11((cStack_92f < cStack_93f) * cStack_93f |
                                 (cStack_92f >= cStack_93f) * cStack_92f,
                                 (cStack_930 < cStack_940) * cStack_940 |
                                 (cStack_930 >= cStack_940) * cStack_930);
          vH[0]._0_3_ = CONCAT12((cStack_92e < cStack_93e) * cStack_93e |
                                 (cStack_92e >= cStack_93e) * cStack_92e,(undefined2)vH[0]);
          vH[0]._0_4_ = CONCAT13((cStack_92d < cStack_93d) * cStack_93d |
                                 (cStack_92d >= cStack_93d) * cStack_92d,(undefined3)vH[0]);
          vH[0]._0_5_ = CONCAT14((cStack_92c < cStack_93c) * cStack_93c |
                                 (cStack_92c >= cStack_93c) * cStack_92c,(undefined4)vH[0]);
          vH[0]._0_6_ = CONCAT15((cStack_92b < cStack_93b) * cStack_93b |
                                 (cStack_92b >= cStack_93b) * cStack_92b,(undefined5)vH[0]);
          vH[0]._0_7_ = CONCAT16((cStack_92a < cStack_93a) * cStack_93a |
                                 (cStack_92a >= cStack_93a) * cStack_92a,(undefined6)vH[0]);
          vH[0] = CONCAT17((cStack_929 < cStack_939) * cStack_939 |
                           (cStack_929 >= cStack_939) * cStack_929,(undefined7)vH[0]);
          auVar52._8_8_ = vHtM[0];
          auVar52._0_8_ = lVar84;
          auVar51._8_8_ = vFM[0];
          auVar51._0_8_ = lVar87;
          auVar50._8_8_ = case1[0];
          auVar50._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar52,auVar51,auVar50);
          auVar49._8_8_ = vHtS[0];
          auVar49._0_8_ = lVar85;
          auVar48._8_8_ = vFS[0];
          auVar48._0_8_ = lVar88;
          auVar47._8_8_ = case1[0];
          auVar47._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar49,auVar48,auVar47);
          auVar46._8_8_ = vHtL[0];
          auVar46._0_8_ = lVar86;
          auVar45._8_8_ = vFL[0];
          auVar45._0_8_ = lVar89;
          auVar44._8_8_ = case1[0];
          auVar44._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar46,auVar45,auVar44);
          for (k = 0; k < iVar77; k = k + 1) {
            lVar16 = ptr[k][0];
            lVar17 = ptr[k][1];
            lVar18 = b[k][0];
            lVar19 = b[k][1];
            auVar29._8_8_ = vH[0];
            auVar29._0_8_ = vHM[1];
            auVar28._8_8_ = uVar11;
            auVar28._0_8_ = uVar8;
            auVar91 = psubsb(auVar29,auVar28);
            auVar27._8_8_ = uVar12;
            auVar27._0_8_ = uVar9;
            auVar92 = psubsb(stack0xffffffffffffeb98,auVar27);
            local_798 = auVar91[0];
            cStack_797 = auVar91[1];
            cStack_796 = auVar91[2];
            cStack_795 = auVar91[3];
            cStack_794 = auVar91[4];
            cStack_793 = auVar91[5];
            cStack_792 = auVar91[6];
            cStack_791 = auVar91[7];
            cStack_790 = auVar91[8];
            cStack_78f = auVar91[9];
            cStack_78e = auVar91[10];
            cStack_78d = auVar91[0xb];
            cStack_78c = auVar91[0xc];
            cStack_78b = auVar91[0xd];
            cStack_78a = auVar91[0xe];
            cStack_789 = auVar91[0xf];
            local_7a8 = auVar92[0];
            cStack_7a7 = auVar92[1];
            cStack_7a6 = auVar92[2];
            cStack_7a5 = auVar92[3];
            cStack_7a4 = auVar92[4];
            cStack_7a3 = auVar92[5];
            cStack_7a2 = auVar92[6];
            cStack_7a1 = auVar92[7];
            cStack_7a0 = auVar92[8];
            cStack_79f = auVar92[9];
            cStack_79e = auVar92[10];
            cStack_79d = auVar92[0xb];
            cStack_79c = auVar92[0xc];
            cStack_79b = auVar92[0xd];
            cStack_79a = auVar92[0xe];
            cStack_799 = auVar92[0xf];
            bVar82 = (local_798 < local_7a8) * local_7a8 | (local_798 >= local_7a8) * local_798;
            bVar98 = (cStack_797 < cStack_7a7) * cStack_7a7 |
                     (cStack_797 >= cStack_7a7) * cStack_797;
            bVar102 = (cStack_796 < cStack_7a6) * cStack_7a6 |
                      (cStack_796 >= cStack_7a6) * cStack_796;
            bVar106 = (cStack_795 < cStack_7a5) * cStack_7a5 |
                      (cStack_795 >= cStack_7a5) * cStack_795;
            bVar110 = (cStack_794 < cStack_7a4) * cStack_7a4 |
                      (cStack_794 >= cStack_7a4) * cStack_794;
            bVar118 = (cStack_793 < cStack_7a3) * cStack_7a3 |
                      (cStack_793 >= cStack_7a3) * cStack_793;
            bVar124 = (cStack_792 < cStack_7a2) * cStack_7a2 |
                      (cStack_792 >= cStack_7a2) * cStack_792;
            bVar130 = (cStack_791 < cStack_7a1) * cStack_7a1 |
                      (cStack_791 >= cStack_7a1) * cStack_791;
            vF[0]._0_1_ = (cStack_790 < cStack_7a0) * cStack_7a0 |
                          (cStack_790 >= cStack_7a0) * cStack_790;
            vF[0]._1_1_ = (cStack_78f < cStack_79f) * cStack_79f |
                          (cStack_78f >= cStack_79f) * cStack_78f;
            vF[0]._2_1_ = (cStack_78e < cStack_79e) * cStack_79e |
                          (cStack_78e >= cStack_79e) * cStack_78e;
            vF[0]._3_1_ = (cStack_78d < cStack_79d) * cStack_79d |
                          (cStack_78d >= cStack_79d) * cStack_78d;
            vF[0]._4_1_ = (cStack_78c < cStack_79c) * cStack_79c |
                          (cStack_78c >= cStack_79c) * cStack_78c;
            vF[0]._5_1_ = (cStack_78b < cStack_79b) * cStack_79b |
                          (cStack_78b >= cStack_79b) * cStack_78b;
            vF[0]._6_1_ = (cStack_78a < cStack_79a) * cStack_79a |
                          (cStack_78a >= cStack_79a) * cStack_78a;
            vF[0]._7_1_ = (cStack_789 < cStack_799) * cStack_799 |
                          (cStack_789 >= cStack_799) * cStack_789;
            vF_ext[1]._0_2_ = CONCAT11(bVar98,bVar82);
            vF_ext[1]._0_3_ = CONCAT12(bVar102,(undefined2)vF_ext[1]);
            vF_ext[1]._0_4_ = CONCAT13(bVar106,(undefined3)vF_ext[1]);
            vF_ext[1]._0_5_ = CONCAT14(bVar110,(undefined4)vF_ext[1]);
            vF_ext[1]._0_6_ = CONCAT15(bVar118,(undefined5)vF_ext[1]);
            vF_ext[1]._0_7_ = CONCAT16(bVar124,(undefined6)vF_ext[1]);
            vF_ext[1] = CONCAT17(bVar130,(undefined7)vF_ext[1]);
            case2[1]._0_2_ = CONCAT11(-(cStack_7a7 < cStack_797),-(local_7a8 < local_798));
            case2[1]._0_3_ = CONCAT12(-(cStack_7a6 < cStack_796),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(cStack_7a5 < cStack_795),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(cStack_7a4 < cStack_794),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(cStack_7a3 < cStack_793),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(cStack_7a2 < cStack_792),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(cStack_7a1 < cStack_791),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(cStack_79f < cStack_78f),-(cStack_7a0 < cStack_790));
            case1[0]._0_3_ = CONCAT12(-(cStack_79e < cStack_78e),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(cStack_79d < cStack_78d),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(cStack_79c < cStack_78c),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(cStack_79b < cStack_78b),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(cStack_79a < cStack_78a),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(cStack_799 < cStack_789),(undefined7)case1[0]);
            auVar43._8_8_ = case1[0];
            auVar43._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb68,stack0xffffffffffffeb28,auVar43);
            auVar42._8_8_ = case1[0];
            auVar42._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb58,stack0xffffffffffffeb18,auVar42);
            auVar41._8_8_ = case1[0];
            auVar41._0_8_ = case2[1];
            auVar91 = pblendvb(stack0xffffffffffffeb48,stack0xffffffffffffeb08,auVar41);
            auVar20._8_8_ = 0x101010101010101;
            auVar20._0_8_ = 0x101010101010101;
            register0x00001200 = paddsb(auVar91,auVar20);
            local_7b8 = (byte)lVar16;
            bStack_7b7 = (byte)((ulong)lVar16 >> 8);
            bStack_7b6 = (byte)((ulong)lVar16 >> 0x10);
            bStack_7b5 = (byte)((ulong)lVar16 >> 0x18);
            bStack_7b4 = (byte)((ulong)lVar16 >> 0x20);
            bStack_7b3 = (byte)((ulong)lVar16 >> 0x28);
            bStack_7b2 = (byte)((ulong)lVar16 >> 0x30);
            bStack_7b1 = (byte)((ulong)lVar16 >> 0x38);
            bStack_7b0 = (byte)lVar17;
            bStack_7af = (byte)((ulong)lVar17 >> 8);
            bStack_7ae = (byte)((ulong)lVar17 >> 0x10);
            bStack_7ad = (byte)((ulong)lVar17 >> 0x18);
            bStack_7ac = (byte)((ulong)lVar17 >> 0x20);
            bStack_7ab = (byte)((ulong)lVar17 >> 0x28);
            bStack_7aa = (byte)((ulong)lVar17 >> 0x30);
            bStack_7a9 = (byte)((ulong)lVar17 >> 0x38);
            local_7c8 = (char)lVar18;
            cStack_7c7 = (char)((ulong)lVar18 >> 8);
            cStack_7c6 = (char)((ulong)lVar18 >> 0x10);
            cStack_7c5 = (char)((ulong)lVar18 >> 0x18);
            cStack_7c4 = (char)((ulong)lVar18 >> 0x20);
            cStack_7c3 = (char)((ulong)lVar18 >> 0x28);
            cStack_7c2 = (char)((ulong)lVar18 >> 0x30);
            cStack_7c1 = (char)((ulong)lVar18 >> 0x38);
            cStack_7c0 = (char)lVar19;
            cStack_7bf = (char)((ulong)lVar19 >> 8);
            cStack_7be = (char)((ulong)lVar19 >> 0x10);
            cStack_7bd = (char)((ulong)lVar19 >> 0x18);
            cStack_7bc = (char)((ulong)lVar19 >> 0x20);
            cStack_7bb = (char)((ulong)lVar19 >> 0x28);
            cStack_7ba = (char)((ulong)lVar19 >> 0x30);
            cStack_7b9 = (char)((ulong)lVar19 >> 0x38);
            bVar96 = ((char)local_7b8 < local_7c8) * local_7c8 |
                     ((char)local_7b8 >= local_7c8) * local_7b8;
            bVar100 = ((char)bStack_7b7 < cStack_7c7) * cStack_7c7 |
                      ((char)bStack_7b7 >= cStack_7c7) * bStack_7b7;
            bVar104 = ((char)bStack_7b6 < cStack_7c6) * cStack_7c6 |
                      ((char)bStack_7b6 >= cStack_7c6) * bStack_7b6;
            bVar108 = ((char)bStack_7b5 < cStack_7c5) * cStack_7c5 |
                      ((char)bStack_7b5 >= cStack_7c5) * bStack_7b5;
            bVar115 = ((char)bStack_7b4 < cStack_7c4) * cStack_7c4 |
                      ((char)bStack_7b4 >= cStack_7c4) * bStack_7b4;
            bVar121 = ((char)bStack_7b3 < cStack_7c3) * cStack_7c3 |
                      ((char)bStack_7b3 >= cStack_7c3) * bStack_7b3;
            bVar127 = ((char)bStack_7b2 < cStack_7c2) * cStack_7c2 |
                      ((char)bStack_7b2 >= cStack_7c2) * bStack_7b2;
            bVar133 = ((char)bStack_7b1 < cStack_7c1) * cStack_7c1 |
                      ((char)bStack_7b1 >= cStack_7c1) * bStack_7b1;
            bVar111 = ((char)bStack_7b0 < cStack_7c0) * cStack_7c0 |
                      ((char)bStack_7b0 >= cStack_7c0) * bStack_7b0;
            bVar116 = ((char)bStack_7af < cStack_7bf) * cStack_7bf |
                      ((char)bStack_7af >= cStack_7bf) * bStack_7af;
            bVar119 = ((char)bStack_7ae < cStack_7be) * cStack_7be |
                      ((char)bStack_7ae >= cStack_7be) * bStack_7ae;
            bVar122 = ((char)bStack_7ad < cStack_7bd) * cStack_7bd |
                      ((char)bStack_7ad >= cStack_7bd) * bStack_7ad;
            bVar125 = ((char)bStack_7ac < cStack_7bc) * cStack_7bc |
                      ((char)bStack_7ac >= cStack_7bc) * bStack_7ac;
            bVar128 = ((char)bStack_7ab < cStack_7bb) * cStack_7bb |
                      ((char)bStack_7ab >= cStack_7bb) * bStack_7ab;
            bVar131 = ((char)bStack_7aa < cStack_7ba) * cStack_7ba |
                      ((char)bStack_7aa >= cStack_7ba) * bStack_7aa;
            bVar134 = ((char)bStack_7a9 < cStack_7b9) * cStack_7b9 |
                      ((char)bStack_7a9 >= cStack_7b9) * bStack_7a9;
            bVar96 = ((char)bVar96 < (char)bVar82) * bVar82 |
                     ((char)bVar96 >= (char)bVar82) * bVar96;
            bVar100 = ((char)bVar100 < (char)bVar98) * bVar98 |
                      ((char)bVar100 >= (char)bVar98) * bVar100;
            bVar104 = ((char)bVar104 < (char)bVar102) * bVar102 |
                      ((char)bVar104 >= (char)bVar102) * bVar104;
            bVar108 = ((char)bVar108 < (char)bVar106) * bVar106 |
                      ((char)bVar108 >= (char)bVar106) * bVar108;
            bVar115 = ((char)bVar115 < (char)bVar110) * bVar110 |
                      ((char)bVar115 >= (char)bVar110) * bVar115;
            bVar121 = ((char)bVar121 < (char)bVar118) * bVar118 |
                      ((char)bVar121 >= (char)bVar118) * bVar121;
            bVar127 = ((char)bVar127 < (char)bVar124) * bVar124 |
                      ((char)bVar127 >= (char)bVar124) * bVar127;
            bVar133 = ((char)bVar133 < (char)bVar130) * bVar130 |
                      ((char)bVar133 >= (char)bVar130) * bVar133;
            bVar111 = ((char)bVar111 < (char)(byte)vF[0]) * (byte)vF[0] |
                      ((char)bVar111 >= (char)(byte)vF[0]) * bVar111;
            bVar116 = ((char)bVar116 < (char)vF[0]._1_1_) * vF[0]._1_1_ |
                      ((char)bVar116 >= (char)vF[0]._1_1_) * bVar116;
            bVar119 = ((char)bVar119 < (char)vF[0]._2_1_) * vF[0]._2_1_ |
                      ((char)bVar119 >= (char)vF[0]._2_1_) * bVar119;
            bVar122 = ((char)bVar122 < (char)vF[0]._3_1_) * vF[0]._3_1_ |
                      ((char)bVar122 >= (char)vF[0]._3_1_) * bVar122;
            bVar125 = ((char)bVar125 < (char)vF[0]._4_1_) * vF[0]._4_1_ |
                      ((char)bVar125 >= (char)vF[0]._4_1_) * bVar125;
            bVar128 = ((char)bVar128 < (char)vF[0]._5_1_) * vF[0]._5_1_ |
                      ((char)bVar128 >= (char)vF[0]._5_1_) * bVar128;
            bVar131 = ((char)bVar131 < (char)vF[0]._6_1_) * vF[0]._6_1_ |
                      ((char)bVar131 >= (char)vF[0]._6_1_) * bVar131;
            bVar134 = ((char)bVar134 < (char)vF[0]._7_1_) * vF[0]._7_1_ |
                      ((char)bVar134 >= (char)vF[0]._7_1_) * bVar134;
            vHM[1]._0_2_ = CONCAT11(bVar100,bVar96);
            vHM[1]._0_3_ = CONCAT12(bVar104,(undefined2)vHM[1]);
            vHM[1]._0_4_ = CONCAT13(bVar108,(undefined3)vHM[1]);
            vHM[1]._0_5_ = CONCAT14(bVar115,(undefined4)vHM[1]);
            vHM[1]._0_6_ = CONCAT15(bVar121,(undefined5)vHM[1]);
            vHM[1]._0_7_ = CONCAT16(bVar127,(undefined6)vHM[1]);
            vHM[1] = CONCAT17(bVar133,(undefined7)vHM[1]);
            vH[0]._0_2_ = CONCAT11(bVar116,bVar111);
            vH[0]._0_3_ = CONCAT12(bVar119,(undefined2)vH[0]);
            vH[0]._0_4_ = CONCAT13(bVar122,(undefined3)vH[0]);
            vH[0]._0_5_ = CONCAT14(bVar125,(undefined4)vH[0]);
            vH[0]._0_6_ = CONCAT15(bVar128,(undefined5)vH[0]);
            vH[0]._0_7_ = CONCAT16(bVar131,(undefined6)vH[0]);
            vH[0] = CONCAT17(bVar134,(undefined7)vH[0]);
            case2[1]._0_2_ = CONCAT11(-(bVar100 == bStack_7b7),-(bVar96 == local_7b8));
            case2[1]._0_3_ = CONCAT12(-(bVar104 == bStack_7b6),(undefined2)case2[1]);
            case2[1]._0_4_ = CONCAT13(-(bVar108 == bStack_7b5),(undefined3)case2[1]);
            case2[1]._0_5_ = CONCAT14(-(bVar115 == bStack_7b4),(undefined4)case2[1]);
            case2[1]._0_6_ = CONCAT15(-(bVar121 == bStack_7b3),(undefined5)case2[1]);
            case2[1]._0_7_ = CONCAT16(-(bVar127 == bStack_7b2),(undefined6)case2[1]);
            case2[1] = CONCAT17(-(bVar133 == bStack_7b1),(undefined7)case2[1]);
            case1[0]._0_2_ = CONCAT11(-(bVar116 == bStack_7af),-(bVar111 == bStack_7b0));
            case1[0]._0_3_ = CONCAT12(-(bVar119 == bStack_7ae),(undefined2)case1[0]);
            case1[0]._0_4_ = CONCAT13(-(bVar122 == bStack_7ad),(undefined3)case1[0]);
            case1[0]._0_5_ = CONCAT14(-(bVar125 == bStack_7ac),(undefined4)case1[0]);
            case1[0]._0_6_ = CONCAT15(-(bVar128 == bStack_7ab),(undefined5)case1[0]);
            case1[0]._0_7_ = CONCAT16(-(bVar131 == bStack_7aa),(undefined6)case1[0]);
            case1[0] = CONCAT17(-(bVar134 == bStack_7a9),(undefined7)case1[0]);
            cVar83 = -(bVar96 == bVar82);
            cVar97 = -(bVar100 == bVar98);
            cVar99 = -(bVar104 == bVar102);
            cVar101 = -(bVar108 == bVar106);
            cVar103 = -(bVar115 == bVar110);
            cVar105 = -(bVar121 == bVar118);
            cVar107 = -(bVar127 == bVar124);
            cVar109 = -(bVar133 == bVar130);
            cVar112 = -(bVar111 == (byte)vF[0]);
            cVar117 = -(bVar116 == vF[0]._1_1_);
            cVar120 = -(bVar119 == vF[0]._2_1_);
            cVar123 = -(bVar122 == vF[0]._3_1_);
            cVar126 = -(bVar125 == vF[0]._4_1_);
            cVar129 = -(bVar128 == vF[0]._5_1_);
            cVar132 = -(bVar131 == vF[0]._6_1_);
            cVar135 = -(bVar134 == vF[0]._7_1_);
            auVar40[1] = cVar97;
            auVar40[0] = cVar83;
            auVar40[2] = cVar99;
            auVar40[3] = cVar101;
            auVar40[4] = cVar103;
            auVar40[5] = cVar105;
            auVar40[6] = cVar107;
            auVar40[7] = cVar109;
            auVar40[9] = cVar117;
            auVar40[8] = cVar112;
            auVar40[10] = cVar120;
            auVar40[0xb] = cVar123;
            auVar40[0xc] = cVar126;
            auVar40[0xd] = cVar129;
            auVar40[0xe] = cVar132;
            auVar40[0xf] = cVar135;
            auVar91 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar40);
            auVar39._8_8_ = case1[0];
            auVar39._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar91,(undefined1  [16])b_03[k],auVar39);
            auVar38[1] = cVar97;
            auVar38[0] = cVar83;
            auVar38[2] = cVar99;
            auVar38[3] = cVar101;
            auVar38[4] = cVar103;
            auVar38[5] = cVar105;
            auVar38[6] = cVar107;
            auVar38[7] = cVar109;
            auVar38[9] = cVar117;
            auVar38[8] = cVar112;
            auVar38[10] = cVar120;
            auVar38[0xb] = cVar123;
            auVar38[0xc] = cVar126;
            auVar38[0xd] = cVar129;
            auVar38[0xe] = cVar132;
            auVar38[0xf] = cVar135;
            auVar91 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar38);
            auVar37._8_8_ = case1[0];
            auVar37._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar91,(undefined1  [16])b_04[k],auVar37);
            auVar36[1] = cVar97;
            auVar36[0] = cVar83;
            auVar36[2] = cVar99;
            auVar36[3] = cVar101;
            auVar36[4] = cVar103;
            auVar36[5] = cVar105;
            auVar36[6] = cVar107;
            auVar36[7] = cVar109;
            auVar36[9] = cVar117;
            auVar36[8] = cVar112;
            auVar36[10] = cVar120;
            auVar36[0xb] = cVar123;
            auVar36[0xc] = cVar126;
            auVar36[0xd] = cVar129;
            auVar36[0xe] = cVar132;
            auVar36[0xf] = cVar135;
            auVar91 = pblendvb((undefined1  [16])b_02[k],register0x00001200,auVar36);
            auVar35._8_8_ = case1[0];
            auVar35._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar91,(undefined1  [16])b_05[k],auVar35);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_98 = (char)vSaturationCheckMax[1];
            cStack_97 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_96 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_95 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_94 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_93 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_92 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_91 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_90 = (char)vSaturationCheckMin[0];
            cStack_8f = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_8e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_8d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_8c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_8b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_8a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_89 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            vSaturationCheckMax[1] =
                 CONCAT17(((char)bVar133 < cStack_91) * bVar133 |
                          ((char)bVar133 >= cStack_91) * cStack_91,
                          CONCAT16(((char)bVar127 < cStack_92) * bVar127 |
                                   ((char)bVar127 >= cStack_92) * cStack_92,
                                   CONCAT15(((char)bVar121 < cStack_93) * bVar121 |
                                            ((char)bVar121 >= cStack_93) * cStack_93,
                                            CONCAT14(((char)bVar115 < cStack_94) * bVar115 |
                                                     ((char)bVar115 >= cStack_94) * cStack_94,
                                                     CONCAT13(((char)bVar108 < cStack_95) * bVar108
                                                              | ((char)bVar108 >= cStack_95) *
                                                                cStack_95,
                                                              CONCAT12(((char)bVar104 < cStack_96) *
                                                                       bVar104 | ((char)bVar104 >=
                                                                                 cStack_96) *
                                                                                 cStack_96,
                                                                       CONCAT11(((char)bVar100 <
                                                                                cStack_97) * bVar100
                                                                                | ((char)bVar100 >=
                                                                                  cStack_97) *
                                                                                  cStack_97,
                                                                                ((char)bVar96 <
                                                                                local_98) * bVar96 |
                                                                                ((char)bVar96 >=
                                                                                local_98) * local_98
                                                                               )))))));
            vSaturationCheckMin[0] =
                 CONCAT17(((char)bVar134 < cStack_89) * bVar134 |
                          ((char)bVar134 >= cStack_89) * cStack_89,
                          CONCAT16(((char)bVar131 < cStack_8a) * bVar131 |
                                   ((char)bVar131 >= cStack_8a) * cStack_8a,
                                   CONCAT15(((char)bVar128 < cStack_8b) * bVar128 |
                                            ((char)bVar128 >= cStack_8b) * cStack_8b,
                                            CONCAT14(((char)bVar125 < cStack_8c) * bVar125 |
                                                     ((char)bVar125 >= cStack_8c) * cStack_8c,
                                                     CONCAT13(((char)bVar122 < cStack_8d) * bVar122
                                                              | ((char)bVar122 >= cStack_8d) *
                                                                cStack_8d,
                                                              CONCAT12(((char)bVar119 < cStack_8e) *
                                                                       bVar119 | ((char)bVar119 >=
                                                                                 cStack_8e) *
                                                                                 cStack_8e,
                                                                       CONCAT11(((char)bVar116 <
                                                                                cStack_8f) * bVar116
                                                                                | ((char)bVar116 >=
                                                                                  cStack_8f) *
                                                                                  cStack_8f,
                                                                                ((char)bVar111 <
                                                                                cStack_90) * bVar111
                                                                                | ((char)bVar111 >=
                                                                                  cStack_90) *
                                                                                  cStack_90)))))));
            local_7f8 = (char)vMaxH[1];
            cStack_7f7 = (char)((ulong)vMaxH[1] >> 8);
            cStack_7f6 = (char)((ulong)vMaxH[1] >> 0x10);
            cStack_7f5 = (char)((ulong)vMaxH[1] >> 0x18);
            cStack_7f4 = (char)((ulong)vMaxH[1] >> 0x20);
            cStack_7f3 = (char)((ulong)vMaxH[1] >> 0x28);
            cStack_7f2 = (char)((ulong)vMaxH[1] >> 0x30);
            cStack_7f1 = (char)((ulong)vMaxH[1] >> 0x38);
            cStack_7f0 = (char)vSaturationCheckMax[0];
            cStack_7ef = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_7ee = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_7ed = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_7ec = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_7eb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_7ea = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_7e9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            bVar82 = (local_7f8 < (char)bVar96) * bVar96 | (local_7f8 >= (char)bVar96) * local_7f8;
            bVar96 = (cStack_7f7 < (char)bVar100) * bVar100 |
                     (cStack_7f7 >= (char)bVar100) * cStack_7f7;
            bVar98 = (cStack_7f6 < (char)bVar104) * bVar104 |
                     (cStack_7f6 >= (char)bVar104) * cStack_7f6;
            bVar100 = (cStack_7f5 < (char)bVar108) * bVar108 |
                      (cStack_7f5 >= (char)bVar108) * cStack_7f5;
            bVar102 = (cStack_7f4 < (char)bVar115) * bVar115 |
                      (cStack_7f4 >= (char)bVar115) * cStack_7f4;
            bVar104 = (cStack_7f3 < (char)bVar121) * bVar121 |
                      (cStack_7f3 >= (char)bVar121) * cStack_7f3;
            bVar106 = (cStack_7f2 < (char)bVar127) * bVar127 |
                      (cStack_7f2 >= (char)bVar127) * cStack_7f2;
            bVar108 = (cStack_7f1 < (char)bVar133) * bVar133 |
                      (cStack_7f1 >= (char)bVar133) * cStack_7f1;
            bVar110 = (cStack_7f0 < (char)bVar111) * bVar111 |
                      (cStack_7f0 >= (char)bVar111) * cStack_7f0;
            bVar115 = (cStack_7ef < (char)bVar116) * bVar116 |
                      (cStack_7ef >= (char)bVar116) * cStack_7ef;
            bVar118 = (cStack_7ee < (char)bVar119) * bVar119 |
                      (cStack_7ee >= (char)bVar119) * cStack_7ee;
            bVar121 = (cStack_7ed < (char)bVar122) * bVar122 |
                      (cStack_7ed >= (char)bVar122) * cStack_7ed;
            bVar124 = (cStack_7ec < (char)bVar125) * bVar125 |
                      (cStack_7ec >= (char)bVar125) * cStack_7ec;
            bVar127 = (cStack_7eb < (char)bVar128) * bVar128 |
                      (cStack_7eb >= (char)bVar128) * cStack_7eb;
            bVar130 = (cStack_7ea < (char)bVar131) * bVar131 |
                      (cStack_7ea >= (char)bVar131) * cStack_7ea;
            bVar133 = (cStack_7e9 < (char)bVar134) * bVar134 |
                      (cStack_7e9 >= (char)bVar134) * cStack_7e9;
            local_828 = (char)vHS[1];
            cStack_827 = vHS[1]._1_1_;
            cStack_826 = vHS[1]._2_1_;
            cStack_825 = vHS[1]._3_1_;
            cStack_824 = vHS[1]._4_1_;
            cStack_823 = vHS[1]._5_1_;
            cStack_822 = vHS[1]._6_1_;
            cStack_821 = vHS[1]._7_1_;
            cStack_820 = (char)vHS[2];
            cStack_81f = vHS[2]._1_1_;
            cStack_81e = vHS[2]._2_1_;
            cStack_81d = vHS[2]._3_1_;
            cStack_81c = vHS[2]._4_1_;
            cStack_81b = vHS[2]._5_1_;
            cStack_81a = vHS[2]._6_1_;
            cStack_819 = vHS[2]._7_1_;
            bVar82 = ((char)bVar82 < local_828) * local_828 | ((char)bVar82 >= local_828) * bVar82;
            bVar96 = ((char)bVar96 < cStack_827) * cStack_827 |
                     ((char)bVar96 >= cStack_827) * bVar96;
            bVar98 = ((char)bVar98 < cStack_826) * cStack_826 |
                     ((char)bVar98 >= cStack_826) * bVar98;
            bVar100 = ((char)bVar100 < cStack_825) * cStack_825 |
                      ((char)bVar100 >= cStack_825) * bVar100;
            bVar102 = ((char)bVar102 < cStack_824) * cStack_824 |
                      ((char)bVar102 >= cStack_824) * bVar102;
            bVar104 = ((char)bVar104 < cStack_823) * cStack_823 |
                      ((char)bVar104 >= cStack_823) * bVar104;
            bVar106 = ((char)bVar106 < cStack_822) * cStack_822 |
                      ((char)bVar106 >= cStack_822) * bVar106;
            bVar108 = ((char)bVar108 < cStack_821) * cStack_821 |
                      ((char)bVar108 >= cStack_821) * bVar108;
            bVar110 = ((char)bVar110 < cStack_820) * cStack_820 |
                      ((char)bVar110 >= cStack_820) * bVar110;
            bVar115 = ((char)bVar115 < cStack_81f) * cStack_81f |
                      ((char)bVar115 >= cStack_81f) * bVar115;
            bVar118 = ((char)bVar118 < cStack_81e) * cStack_81e |
                      ((char)bVar118 >= cStack_81e) * bVar118;
            bVar121 = ((char)bVar121 < cStack_81d) * cStack_81d |
                      ((char)bVar121 >= cStack_81d) * bVar121;
            bVar124 = ((char)bVar124 < cStack_81c) * cStack_81c |
                      ((char)bVar124 >= cStack_81c) * bVar124;
            bVar127 = ((char)bVar127 < cStack_81b) * cStack_81b |
                      ((char)bVar127 >= cStack_81b) * bVar127;
            bVar130 = ((char)bVar130 < cStack_81a) * cStack_81a |
                      ((char)bVar130 >= cStack_81a) * bVar130;
            bVar133 = ((char)bVar133 < cStack_819) * cStack_819 |
                      ((char)bVar133 >= cStack_819) * bVar133;
            local_848 = (char)vHL[1];
            cStack_847 = vHL[1]._1_1_;
            cStack_846 = vHL[1]._2_1_;
            cStack_845 = vHL[1]._3_1_;
            cStack_844 = vHL[1]._4_1_;
            cStack_843 = vHL[1]._5_1_;
            cStack_842 = vHL[1]._6_1_;
            cStack_841 = vHL[1]._7_1_;
            cStack_840 = (char)vHL[2];
            cStack_83f = vHL[2]._1_1_;
            cStack_83e = vHL[2]._2_1_;
            cStack_83d = vHL[2]._3_1_;
            cStack_83c = vHL[2]._4_1_;
            cStack_83b = vHL[2]._5_1_;
            cStack_83a = vHL[2]._6_1_;
            cStack_839 = vHL[2]._7_1_;
            bVar82 = ((char)bVar82 < local_848) * local_848 | ((char)bVar82 >= local_848) * bVar82;
            bVar96 = ((char)bVar96 < cStack_847) * cStack_847 |
                     ((char)bVar96 >= cStack_847) * bVar96;
            bVar98 = ((char)bVar98 < cStack_846) * cStack_846 |
                     ((char)bVar98 >= cStack_846) * bVar98;
            bVar100 = ((char)bVar100 < cStack_845) * cStack_845 |
                      ((char)bVar100 >= cStack_845) * bVar100;
            bVar102 = ((char)bVar102 < cStack_844) * cStack_844 |
                      ((char)bVar102 >= cStack_844) * bVar102;
            bVar104 = ((char)bVar104 < cStack_843) * cStack_843 |
                      ((char)bVar104 >= cStack_843) * bVar104;
            bVar106 = ((char)bVar106 < cStack_842) * cStack_842 |
                      ((char)bVar106 >= cStack_842) * bVar106;
            bVar108 = ((char)bVar108 < cStack_841) * cStack_841 |
                      ((char)bVar108 >= cStack_841) * bVar108;
            bVar110 = ((char)bVar110 < cStack_840) * cStack_840 |
                      ((char)bVar110 >= cStack_840) * bVar110;
            bVar115 = ((char)bVar115 < cStack_83f) * cStack_83f |
                      ((char)bVar115 >= cStack_83f) * bVar115;
            bVar118 = ((char)bVar118 < cStack_83e) * cStack_83e |
                      ((char)bVar118 >= cStack_83e) * bVar118;
            bVar121 = ((char)bVar121 < cStack_83d) * cStack_83d |
                      ((char)bVar121 >= cStack_83d) * bVar121;
            bVar124 = ((char)bVar124 < cStack_83c) * cStack_83c |
                      ((char)bVar124 >= cStack_83c) * bVar124;
            bVar127 = ((char)bVar127 < cStack_83b) * cStack_83b |
                      ((char)bVar127 >= cStack_83b) * bVar127;
            bVar130 = ((char)bVar130 < cStack_83a) * cStack_83a |
                      ((char)bVar130 >= cStack_83a) * bVar130;
            bVar133 = ((char)bVar133 < cStack_839) * cStack_839 |
                      ((char)bVar133 >= cStack_839) * bVar133;
            local_868 = (char)vHp[1];
            cStack_867 = vHp[1]._1_1_;
            cStack_866 = vHp[1]._2_1_;
            cStack_865 = vHp[1]._3_1_;
            cStack_864 = vHp[1]._4_1_;
            cStack_863 = vHp[1]._5_1_;
            cStack_862 = vHp[1]._6_1_;
            cStack_861 = vHp[1]._7_1_;
            cStack_860 = (char)vHp[2];
            cStack_85f = vHp[2]._1_1_;
            cStack_85e = vHp[2]._2_1_;
            cStack_85d = vHp[2]._3_1_;
            cStack_85c = vHp[2]._4_1_;
            cStack_85b = vHp[2]._5_1_;
            cStack_85a = vHp[2]._6_1_;
            cStack_859 = vHp[2]._7_1_;
            vMaxH[1] = CONCAT17(((char)bVar108 < cStack_861) * cStack_861 |
                                ((char)bVar108 >= cStack_861) * bVar108,
                                CONCAT16(((char)bVar106 < cStack_862) * cStack_862 |
                                         ((char)bVar106 >= cStack_862) * bVar106,
                                         CONCAT15(((char)bVar104 < cStack_863) * cStack_863 |
                                                  ((char)bVar104 >= cStack_863) * bVar104,
                                                  CONCAT14(((char)bVar102 < cStack_864) * cStack_864
                                                           | ((char)bVar102 >= cStack_864) * bVar102
                                                           ,CONCAT13(((char)bVar100 < cStack_865) *
                                                                     cStack_865 |
                                                                     ((char)bVar100 >= cStack_865) *
                                                                     bVar100,CONCAT12(((char)bVar98
                                                                                      < cStack_866)
                                                                                      * cStack_866 |
                                                                                      ((char)bVar98
                                                                                      >= cStack_866)
                                                                                      * bVar98,
                                                  CONCAT11(((char)bVar96 < cStack_867) * cStack_867
                                                           | ((char)bVar96 >= cStack_867) * bVar96,
                                                           ((char)bVar82 < local_868) * local_868 |
                                                           ((char)bVar82 >= local_868) * bVar82)))))
                                        ));
            vSaturationCheckMax[0] =
                 CONCAT17(((char)bVar133 < cStack_859) * cStack_859 |
                          ((char)bVar133 >= cStack_859) * bVar133,
                          CONCAT16(((char)bVar130 < cStack_85a) * cStack_85a |
                                   ((char)bVar130 >= cStack_85a) * bVar130,
                                   CONCAT15(((char)bVar127 < cStack_85b) * cStack_85b |
                                            ((char)bVar127 >= cStack_85b) * bVar127,
                                            CONCAT14(((char)bVar124 < cStack_85c) * cStack_85c |
                                                     ((char)bVar124 >= cStack_85c) * bVar124,
                                                     CONCAT13(((char)bVar121 < cStack_85d) *
                                                              cStack_85d |
                                                              ((char)bVar121 >= cStack_85d) *
                                                              bVar121,CONCAT12(((char)bVar118 <
                                                                               cStack_85e) *
                                                                               cStack_85e |
                                                                               ((char)bVar118 >=
                                                                               cStack_85e) * bVar118
                                                                               ,CONCAT11(((char)
                                                  bVar115 < cStack_85f) * cStack_85f |
                                                  ((char)bVar115 >= cStack_85f) * bVar115,
                                                  ((char)bVar110 < cStack_860) * cStack_860 |
                                                  ((char)bVar110 >= cStack_860) * bVar110)))))));
          }
          lVar16 = ptr[iVar81][0];
          lVar17 = ptr[iVar81][1];
          local_978 = (char)lVar16;
          cStack_977 = (char)((ulong)lVar16 >> 8);
          cStack_976 = (char)((ulong)lVar16 >> 0x10);
          cStack_975 = (char)((ulong)lVar16 >> 0x18);
          cStack_974 = (char)((ulong)lVar16 >> 0x20);
          cStack_973 = (char)((ulong)lVar16 >> 0x28);
          cStack_972 = (char)((ulong)lVar16 >> 0x30);
          cStack_971 = (char)((ulong)lVar16 >> 0x38);
          cStack_970 = (char)lVar17;
          cStack_96f = (char)((ulong)lVar17 >> 8);
          cStack_96e = (char)((ulong)lVar17 >> 0x10);
          cStack_96d = (char)((ulong)lVar17 >> 0x18);
          cStack_96c = (char)((ulong)lVar17 >> 0x20);
          cStack_96b = (char)((ulong)lVar17 >> 0x28);
          cStack_96a = (char)((ulong)lVar17 >> 0x30);
          cStack_969 = (char)((ulong)lVar17 >> 0x38);
          local_988 = (char)vMaxM[1];
          cStack_987 = (char)((ulong)vMaxM[1] >> 8);
          cStack_986 = (char)((ulong)vMaxM[1] >> 0x10);
          cStack_985 = (char)((ulong)vMaxM[1] >> 0x18);
          cStack_984 = (char)((ulong)vMaxM[1] >> 0x20);
          cStack_983 = (char)((ulong)vMaxM[1] >> 0x28);
          cStack_982 = (char)((ulong)vMaxM[1] >> 0x30);
          cStack_981 = (char)((ulong)vMaxM[1] >> 0x38);
          cStack_980 = (char)vMaxH[0];
          cStack_97f = (char)((ulong)vMaxH[0] >> 8);
          cStack_97e = (char)((ulong)vMaxH[0] >> 0x10);
          cStack_97d = (char)((ulong)vMaxH[0] >> 0x18);
          cStack_97c = (char)((ulong)vMaxH[0] >> 0x20);
          cStack_97b = (char)((ulong)vMaxH[0] >> 0x28);
          cStack_97a = (char)((ulong)vMaxH[0] >> 0x30);
          cStack_979 = (char)((ulong)vMaxH[0] >> 0x38);
          cVar83 = -(local_988 < local_978);
          cVar97 = -(cStack_987 < cStack_977);
          cVar99 = -(cStack_986 < cStack_976);
          cVar101 = -(cStack_985 < cStack_975);
          cVar103 = -(cStack_984 < cStack_974);
          cVar105 = -(cStack_983 < cStack_973);
          cVar107 = -(cStack_982 < cStack_972);
          cVar109 = -(cStack_981 < cStack_971);
          cVar112 = -(cStack_980 < cStack_970);
          cVar117 = -(cStack_97f < cStack_96f);
          cVar120 = -(cStack_97e < cStack_96e);
          cVar123 = -(cStack_97d < cStack_96d);
          cVar126 = -(cStack_97c < cStack_96c);
          cVar129 = -(cStack_97b < cStack_96b);
          cVar132 = -(cStack_97a < cStack_96a);
          cVar135 = -(cStack_979 < cStack_969);
          vMaxM[1] = CONCAT17((cStack_981 < cStack_971) * cStack_971 |
                              (cStack_981 >= cStack_971) * cStack_981,
                              CONCAT16((cStack_982 < cStack_972) * cStack_972 |
                                       (cStack_982 >= cStack_972) * cStack_982,
                                       CONCAT15((cStack_983 < cStack_973) * cStack_973 |
                                                (cStack_983 >= cStack_973) * cStack_983,
                                                CONCAT14((cStack_984 < cStack_974) * cStack_974 |
                                                         (cStack_984 >= cStack_974) * cStack_984,
                                                         CONCAT13((cStack_985 < cStack_975) *
                                                                  cStack_975 |
                                                                  (cStack_985 >= cStack_975) *
                                                                  cStack_985,
                                                                  CONCAT12((cStack_986 < cStack_976)
                                                                           * cStack_976 |
                                                                           (cStack_986 >= cStack_976
                                                                           ) * cStack_986,
                                                                           CONCAT11((cStack_987 <
                                                                                    cStack_977) *
                                                                                    cStack_977 |
                                                                                    (cStack_987 >=
                                                                                    cStack_977) *
                                                                                    cStack_987,
                                                                                    (local_988 <
                                                                                    local_978) *
                                                                                    local_978 |
                                                                                    (local_988 >=
                                                                                    local_978) *
                                                                                    local_988)))))))
          ;
          vMaxH[0] = CONCAT17((cStack_979 < cStack_969) * cStack_969 |
                              (cStack_979 >= cStack_969) * cStack_979,
                              CONCAT16((cStack_97a < cStack_96a) * cStack_96a |
                                       (cStack_97a >= cStack_96a) * cStack_97a,
                                       CONCAT15((cStack_97b < cStack_96b) * cStack_96b |
                                                (cStack_97b >= cStack_96b) * cStack_97b,
                                                CONCAT14((cStack_97c < cStack_96c) * cStack_96c |
                                                         (cStack_97c >= cStack_96c) * cStack_97c,
                                                         CONCAT13((cStack_97d < cStack_96d) *
                                                                  cStack_96d |
                                                                  (cStack_97d >= cStack_96d) *
                                                                  cStack_97d,
                                                                  CONCAT12((cStack_97e < cStack_96e)
                                                                           * cStack_96e |
                                                                           (cStack_97e >= cStack_96e
                                                                           ) * cStack_97e,
                                                                           CONCAT11((cStack_97f <
                                                                                    cStack_96f) *
                                                                                    cStack_96f |
                                                                                    (cStack_97f >=
                                                                                    cStack_96f) *
                                                                                    cStack_97f,
                                                                                    (cStack_980 <
                                                                                    cStack_970) *
                                                                                    cStack_970 |
                                                                                    (cStack_980 >=
                                                                                    cStack_970) *
                                                                                    cStack_980))))))
                             );
          auVar34[1] = cVar97;
          auVar34[0] = cVar83;
          auVar34[2] = cVar99;
          auVar34[3] = cVar101;
          auVar34[4] = cVar103;
          auVar34[5] = cVar105;
          auVar34[6] = cVar107;
          auVar34[7] = cVar109;
          auVar34[9] = cVar117;
          auVar34[8] = cVar112;
          auVar34[10] = cVar120;
          auVar34[0xb] = cVar123;
          auVar34[0xc] = cVar126;
          auVar34[0xd] = cVar129;
          auVar34[0xe] = cVar132;
          auVar34[0xf] = cVar135;
          register0x00001240 =
               pblendvb(stack0xffffffffffffed08,(undefined1  [16])b_03[iVar81],auVar34);
          auVar33[1] = cVar97;
          auVar33[0] = cVar83;
          auVar33[2] = cVar99;
          auVar33[3] = cVar101;
          auVar33[4] = cVar103;
          auVar33[5] = cVar105;
          auVar33[6] = cVar107;
          auVar33[7] = cVar109;
          auVar33[9] = cVar117;
          auVar33[8] = cVar112;
          auVar33[10] = cVar120;
          auVar33[0xb] = cVar123;
          auVar33[0xc] = cVar126;
          auVar33[0xd] = cVar129;
          auVar33[0xe] = cVar132;
          auVar33[0xf] = cVar135;
          register0x00001240 =
               pblendvb(stack0xffffffffffffecf8,(undefined1  [16])b_04[iVar81],auVar33);
          auVar32[1] = cVar97;
          auVar32[0] = cVar83;
          auVar32[2] = cVar99;
          auVar32[3] = cVar101;
          auVar32[4] = cVar103;
          auVar32[5] = cVar105;
          auVar32[6] = cVar107;
          auVar32[7] = cVar109;
          auVar32[9] = cVar117;
          auVar32[8] = cVar112;
          auVar32[10] = cVar120;
          auVar32[0xb] = cVar123;
          auVar32[0xc] = cVar126;
          auVar32[0xd] = cVar129;
          auVar32[0xe] = cVar132;
          auVar32[0xf] = cVar135;
          register0x00001240 =
               pblendvb(stack0xffffffffffffece8,(undefined1  [16])b_05[iVar81],auVar32);
          uVar114 = CONCAT17(-((char)pvP == '\0'),
                             CONCAT16(-((char)pvP == '\x01'),
                                      CONCAT15(-((char)pvP == '\x02'),
                                               CONCAT14(-((char)pvP == '\x03'),
                                                        CONCAT13(-((char)pvP == '\x04'),
                                                                 CONCAT12(-((char)pvP == '\x05'),
                                                                          CONCAT11(-((char)pvP ==
                                                                                    '\x06'),-((char)
                                                  pvP == '\a')))))))) &
                    CONCAT17(cVar135,CONCAT16(cVar132,CONCAT15(cVar129,CONCAT14(cVar126,CONCAT13(
                                                  cVar123,CONCAT12(cVar120,CONCAT11(cVar117,cVar112)
                                                                  ))))));
          auVar73._8_8_ = uVar114;
          auVar73._0_8_ =
               CONCAT17(-((char)pvP == '\b'),
                        CONCAT16(-((char)pvP == '\t'),
                                 CONCAT15(-((char)pvP == '\n'),
                                          CONCAT14(-((char)pvP == '\v'),
                                                   CONCAT13(-((char)pvP == '\f'),
                                                            CONCAT12(-((char)pvP == '\r'),
                                                                     CONCAT11(-((char)pvP == '\x0e')
                                                                              ,-((char)pvP == '\x0f'
                                                                                )))))))) &
               CONCAT17(cVar109,CONCAT16(cVar107,CONCAT15(cVar105,CONCAT14(cVar103,CONCAT13(cVar101,
                                                  CONCAT12(cVar99,CONCAT11(cVar97,cVar83)))))));
          if ((((((((((((((((auVar73 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar73 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar73 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar73 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar73 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar114 >> 7 & 1) != 0) || (uVar114 >> 0xf & 1) != 0) ||
                  (uVar114 >> 0x17 & 1) != 0) || (uVar114 >> 0x1f & 1) != 0) ||
                (uVar114 >> 0x27 & 1) != 0) || (uVar114 >> 0x2f & 1) != 0) ||
              (uVar114 >> 0x37 & 1) != 0) || (long)uVar114 < 0) {
            matrix._0_4_ = s1Len;
          }
        }
        local_1289 = bVar75;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar78; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 8 | (ulong)vMaxM[1] >> 0x38;
            vMaxM[0] = vMaxM[0] << 8 | (ulong)vMaxS[1] >> 0x38;
            vMaxS[1] = vMaxS[1] << 8;
            vMaxS[0] = vMaxS[0] << 8 | (ulong)vMaxL[1] >> 0x38;
            vMaxL[1] = vMaxL[1] << 8;
            vMaxL[0] = vMaxL[0] << 8 | (ulong)vPosMask[1] >> 0x38;
            vPosMask[1] = vPosMask[1] << 8;
            vMaxM[1] = vMaxM[1] << 8;
          }
          local_1289 = vMaxH[0]._7_1_;
          local_128a = vMaxM[0]._7_1_;
          local_128b = vMaxS[0]._7_1_;
          local_128c = vMaxL[0]._7_1_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = b_05;
          l = (int8_t *)b_04;
          s = (int8_t *)b_03;
          m = (int8_t *)ptr;
          for (k = 0; k < iVar77 * 0x10; k = k + 1) {
            iVar79 = k / 0x10 + (k % 0x10) * iVar77;
            if (iVar79 < iVar1) {
              if ((char)local_1289 < *m) {
                local_1289 = *m;
                matrix._0_4_ = s2Len + -1;
                local_128a = *s;
                local_128b = *l;
                local_128c = (char)(*_temp)[0];
                matrix._4_4_ = iVar79;
              }
              else if (((*m == local_1289) && ((int)matrix == s2Len + -1)) &&
                      (iVar79 < matrix._4_4_)) {
                local_128a = *s;
                local_128b = *l;
                local_128c = (char)(*_temp)[0];
                matrix._4_4_ = iVar79;
              }
            }
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = ptr[iVar81][1];
          vHM_1[0] = b_03[iVar81][1];
          vHS_1[0] = b_04[iVar81][1];
          vHL_1[0] = b_05[iVar81][1];
          uStack_1698 = b_05[iVar81][0];
          vHL_1[1] = b_04[iVar81][0];
          vHS_1[1] = b_03[iVar81][0];
          vHM_1[1] = ptr[iVar81][0];
          for (end_query = 0; end_query < iVar78; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 8 | (ulong)vHM_1[1] >> 0x38;
            vHM_1[0] = vHM_1[0] << 8 | (ulong)vHS_1[1] >> 0x38;
            vHS_1[0] = vHS_1[0] << 8 | (ulong)vHL_1[1] >> 0x38;
            vHL_1[0] = vHL_1[0] << 8 | uStack_1698 >> 0x38;
            uStack_1698 = uStack_1698 << 8;
            vHL_1[1] = vHL_1[1] << 8;
            vHS_1[1] = vHS_1[1] << 8;
            vHM_1[1] = vHM_1[1] << 8;
          }
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
          local_1289 = vH_1[0]._7_1_;
          local_128a = vHM_1[0]._7_1_;
          local_128b = vHS_1[0]._7_1_;
          local_128c = vHL_1[0]._7_1_;
        }
        local_28 = (char)vSaturationCheckMax[1];
        cStack_27 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_26 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_25 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_24 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_23 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_22 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_21 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_20 = (char)vSaturationCheckMin[0];
        cStack_1f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_19 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_998 = (char)vMaxH[1];
        cStack_997 = (char)((ulong)vMaxH[1] >> 8);
        cStack_996 = (char)((ulong)vMaxH[1] >> 0x10);
        cStack_995 = (char)((ulong)vMaxH[1] >> 0x18);
        cStack_994 = (char)((ulong)vMaxH[1] >> 0x20);
        cStack_993 = (char)((ulong)vMaxH[1] >> 0x28);
        cStack_992 = (char)((ulong)vMaxH[1] >> 0x30);
        cStack_991 = (char)((ulong)vMaxH[1] >> 0x38);
        cStack_990 = (char)vSaturationCheckMax[0];
        cStack_98f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_98e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_98d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_98c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_98b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_98a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_989 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar114 = CONCAT17(-(cStack_19 < (char)bVar75),
                           CONCAT16(-(cStack_1a < (char)bVar75),
                                    CONCAT15(-(cStack_1b < (char)bVar75),
                                             CONCAT14(-(cStack_1c < (char)bVar75),
                                                      CONCAT13(-(cStack_1d < (char)bVar75),
                                                               CONCAT12(-(cStack_1e < (char)bVar75),
                                                                        CONCAT11(-(cStack_1f <
                                                                                  (char)bVar75),
                                                                                 -(cStack_20 <
                                                                                  (char)bVar75))))))
                                   )) |
                  CONCAT17(-(cVar76 < cStack_989),
                           CONCAT16(-(cVar76 < cStack_98a),
                                    CONCAT15(-(cVar76 < cStack_98b),
                                             CONCAT14(-(cVar76 < cStack_98c),
                                                      CONCAT13(-(cVar76 < cStack_98d),
                                                               CONCAT12(-(cVar76 < cStack_98e),
                                                                        CONCAT11(-(cVar76 < 
                                                  cStack_98f),-(cVar76 < cStack_990))))))));
        auVar72._8_8_ = uVar114;
        auVar72._0_8_ =
             CONCAT17(-(cStack_21 < (char)bVar75),
                      CONCAT16(-(cStack_22 < (char)bVar75),
                               CONCAT15(-(cStack_23 < (char)bVar75),
                                        CONCAT14(-(cStack_24 < (char)bVar75),
                                                 CONCAT13(-(cStack_25 < (char)bVar75),
                                                          CONCAT12(-(cStack_26 < (char)bVar75),
                                                                   CONCAT11(-(cStack_27 <
                                                                             (char)bVar75),
                                                                            -(local_28 <
                                                                             (char)bVar75)))))))) |
             CONCAT17(-(cVar76 < cStack_991),
                      CONCAT16(-(cVar76 < cStack_992),
                               CONCAT15(-(cVar76 < cStack_993),
                                        CONCAT14(-(cVar76 < cStack_994),
                                                 CONCAT13(-(cVar76 < cStack_995),
                                                          CONCAT12(-(cVar76 < cStack_996),
                                                                   CONCAT11(-(cVar76 < cStack_997),
                                                                            -(cVar76 < local_998))))
                                                ))));
        if ((((((((((((((((auVar72 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar72 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar72 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar72 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar72 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar72 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar114 >> 7 & 1) != 0) || (uVar114 >> 0xf & 1) != 0) ||
                (uVar114 >> 0x17 & 1) != 0) || (uVar114 >> 0x1f & 1) != 0) ||
              (uVar114 >> 0x27 & 1) != 0) || (uVar114 >> 0x2f & 1) != 0) ||
            (uVar114 >> 0x37 & 1) != 0) || (long)uVar114 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_1289 = 0;
          local_128a = '\0';
          local_128b = '\0';
          local_128c = '\0';
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)(char)local_1289;
        *(int *)((long)&profile_local->s1 + 4) = matrix._4_4_;
        profile_local->s1Len = (int)matrix;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_128a;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_128b;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_128c;
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile8.score;
    pvPm = (__m128i*)profile->profile8.matches;
    pvPs = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi8(segLen), 1);
    vNegInfFront = _mm_insert_epi8(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            vGapperL = _mm_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHpM = _mm_slli_si128(vHpM, 1);
        vHpS = _mm_slli_si128(vHpS, 1);
        vHpL = _mm_slli_si128(vHpL, 1);
        vHp = _mm_insert_epi8(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi8(vH, vGapO);
            vE_ext = _mm_subs_epi8(vE, vGapE);
            case1 = _mm_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm_max_epi8(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi8(vEL, vOne);
            vGapper = _mm_adds_epi8(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vF, vGapper),
                    _mm_cmpeq_epi8(vF, vGapper));
            vF = _mm_max_epi8(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi8(vHp, vW);
            vHpM = _mm_adds_epi8(vHpM, vWM);
            vHpS = _mm_adds_epi8(vHpS, vWS);
            vHpL = _mm_adds_epi8(vHpL, vOne);
            case1 = _mm_cmpgt_epi8(vE, vHp);
            vHt = _mm_max_epi8(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHtM = _mm_slli_si128(vHtM, 1);
        vHtS = _mm_slli_si128(vHtS, 1);
        vHtL = _mm_slli_si128(vHtL, 1);
        vHt = _mm_insert_epi8(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi8(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi8(vGapper, vF),
                _mm_cmpeq_epi8(vGapper, vF));
        vF = _mm_max_epi8(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            __m128i vFtM = _mm_slli_si128(vFM, 1);
            __m128i vFtS = _mm_slli_si128(vFS, 1);
            __m128i vFtL = _mm_slli_si128(vFL, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vFt, vF),
                    _mm_cmpeq_epi8(vFt, vF));
            vF = _mm_max_epi8(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vFM = _mm_slli_si128(vFM, 1);
        vFS = _mm_slli_si128(vFS, 1);
        vFL = _mm_slli_si128(vFL, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi8(vF, vHt);
        vH = _mm_max_epi8(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi8(vH, vGapO);
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi8(vFL, vOne);
            vH = _mm_max_epi8(vHp, vE);
            vH = _mm_max_epi8(vH, vF);
            case1 = _mm_cmpeq_epi8(vH, vHp);
            case2 = _mm_cmpeq_epi8(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm_max_epi8(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
                vHM = _mm_slli_si128(vHM, 1);
                vHS = _mm_slli_si128(vHS, 1);
                vHL = _mm_slli_si128(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
            result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
            vMaxM = _mm_slli_si128(vMaxM, 1);
            vMaxS = _mm_slli_si128(vMaxS, 1);
            vMaxL = _mm_slli_si128(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm_extract_epi8(vMaxH, 15);
        matches = (int8_t) _mm_extract_epi8(vMaxM, 15);
        similar = (int8_t) _mm_extract_epi8(vMaxS, 15);
        length = (int8_t) _mm_extract_epi8(vMaxL, 15);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}